

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar75;
  ulong uVar76;
  undefined4 uVar77;
  undefined8 in_R9;
  byte bVar78;
  bool bVar79;
  undefined8 uVar80;
  vint4 bi_2;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar86 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar111;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 ai_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar166;
  undefined1 auVar165 [32];
  float fVar167;
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar176 [32];
  float fVar183;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar187;
  float fVar204;
  float fVar205;
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar195 [32];
  float fVar206;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar210;
  float fVar218;
  float fVar219;
  vint4 ai_1;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar220;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar217 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  float fVar233;
  undefined1 auVar234 [16];
  float fVar243;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar241;
  float fVar242;
  undefined1 auVar240 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  float fVar257;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar258 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar266 [64];
  float s;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar278 [32];
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  int local_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  RTCFilterFunctionNArguments local_930;
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined4 local_8d8;
  float local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  uint local_8c8;
  uint local_8c4;
  uint local_8c0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar277 [16];
  
  PVar3 = prim[1];
  uVar72 = (ulong)(byte)PVar3;
  auVar10 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar187 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar81._0_4_ = fVar187 * auVar10._0_4_;
  auVar81._4_4_ = fVar187 * auVar10._4_4_;
  auVar81._8_4_ = fVar187 * auVar10._8_4_;
  auVar81._12_4_ = fVar187 * auVar10._12_4_;
  auVar188._0_4_ = fVar187 * (ray->dir).field_0.m128[0];
  auVar188._4_4_ = fVar187 * (ray->dir).field_0.m128[1];
  auVar188._8_4_ = fVar187 * (ray->dir).field_0.m128[2];
  auVar188._12_4_ = fVar187 * (ray->dir).field_0.m128[3];
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar271 = vcvtdq2ps_avx(auVar271);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xc + 6)));
  auVar250 = vcvtdq2ps_avx(auVar250);
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xd + 6)));
  auVar272 = vcvtdq2ps_avx(auVar272);
  auVar266 = ZEXT1664(auVar272);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x12 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x13 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x14 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar276._4_4_ = auVar188._0_4_;
  auVar276._0_4_ = auVar188._0_4_;
  auVar276._8_4_ = auVar188._0_4_;
  auVar276._12_4_ = auVar188._0_4_;
  auVar113 = vshufps_avx(auVar188,auVar188,0x55);
  auVar82 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar187 = auVar82._0_4_;
  auVar249._0_4_ = fVar187 * auVar88._0_4_;
  fVar204 = auVar82._4_4_;
  auVar249._4_4_ = fVar204 * auVar88._4_4_;
  fVar205 = auVar82._8_4_;
  auVar249._8_4_ = fVar205 * auVar88._8_4_;
  fVar206 = auVar82._12_4_;
  auVar249._12_4_ = fVar206 * auVar88._12_4_;
  auVar244._0_4_ = auVar272._0_4_ * fVar187;
  auVar244._4_4_ = auVar272._4_4_ * fVar204;
  auVar244._8_4_ = auVar272._8_4_ * fVar205;
  auVar244._12_4_ = auVar272._12_4_ * fVar206;
  auVar224._0_4_ = auVar135._0_4_ * fVar187;
  auVar224._4_4_ = auVar135._4_4_ * fVar204;
  auVar224._8_4_ = auVar135._8_4_ * fVar205;
  auVar224._12_4_ = auVar135._12_4_ * fVar206;
  auVar82 = vfmadd231ps_fma(auVar249,auVar113,auVar7);
  auVar114 = vfmadd231ps_fma(auVar244,auVar113,auVar250);
  auVar113 = vfmadd231ps_fma(auVar224,auVar83,auVar113);
  auVar152 = vfmadd231ps_fma(auVar82,auVar276,auVar10);
  auVar255 = ZEXT1664(auVar152);
  auVar114 = vfmadd231ps_fma(auVar114,auVar276,auVar271);
  auVar169 = vfmadd231ps_fma(auVar113,auVar84,auVar276);
  auVar277._4_4_ = auVar81._0_4_;
  auVar277._0_4_ = auVar81._0_4_;
  auVar277._8_4_ = auVar81._0_4_;
  auVar277._12_4_ = auVar81._0_4_;
  auVar279 = ZEXT1664(auVar277);
  auVar113 = vshufps_avx(auVar81,auVar81,0x55);
  auVar82 = vshufps_avx(auVar81,auVar81,0xaa);
  fVar187 = auVar82._0_4_;
  auVar189._0_4_ = fVar187 * auVar88._0_4_;
  fVar204 = auVar82._4_4_;
  auVar189._4_4_ = fVar204 * auVar88._4_4_;
  fVar205 = auVar82._8_4_;
  auVar189._8_4_ = fVar205 * auVar88._8_4_;
  fVar206 = auVar82._12_4_;
  auVar189._12_4_ = fVar206 * auVar88._12_4_;
  auVar112._0_4_ = auVar272._0_4_ * fVar187;
  auVar112._4_4_ = auVar272._4_4_ * fVar204;
  auVar112._8_4_ = auVar272._8_4_ * fVar205;
  auVar112._12_4_ = auVar272._12_4_ * fVar206;
  auVar82._0_4_ = auVar135._0_4_ * fVar187;
  auVar82._4_4_ = auVar135._4_4_ * fVar204;
  auVar82._8_4_ = auVar135._8_4_ * fVar205;
  auVar82._12_4_ = auVar135._12_4_ * fVar206;
  auVar7 = vfmadd231ps_fma(auVar189,auVar113,auVar7);
  auVar88 = vfmadd231ps_fma(auVar112,auVar113,auVar250);
  auVar250 = vfmadd231ps_fma(auVar82,auVar113,auVar83);
  auVar272 = vfmadd231ps_fma(auVar7,auVar277,auVar10);
  auVar83 = vfmadd231ps_fma(auVar88,auVar277,auVar271);
  local_980._8_4_ = 0x7fffffff;
  local_980._0_8_ = 0x7fffffff7fffffff;
  local_980._12_4_ = 0x7fffffff;
  auVar135 = vfmadd231ps_fma(auVar250,auVar277,auVar84);
  auVar10 = vandps_avx(auVar152,local_980);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  auVar10 = vcmpps_avx(auVar10,auVar168,1);
  auVar7 = vblendvps_avx(auVar152,auVar168,auVar10);
  auVar10 = vandps_avx(auVar114,local_980);
  auVar10 = vcmpps_avx(auVar10,auVar168,1);
  auVar88 = vblendvps_avx(auVar114,auVar168,auVar10);
  auVar10 = vandps_avx(local_980,auVar169);
  auVar10 = vcmpps_avx(auVar10,auVar168,1);
  auVar10 = vblendvps_avx(auVar169,auVar168,auVar10);
  auVar271 = vrcpps_avx(auVar7);
  auVar225._8_4_ = 0x3f800000;
  auVar225._0_8_ = 0x3f8000003f800000;
  auVar225._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar271,auVar225);
  auVar271 = vfmadd132ps_fma(auVar7,auVar271,auVar271);
  auVar7 = vrcpps_avx(auVar88);
  auVar88 = vfnmadd213ps_fma(auVar88,auVar7,auVar225);
  auVar250 = vfmadd132ps_fma(auVar88,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar7,auVar225);
  auVar84 = vfmadd132ps_fma(auVar10,auVar7,auVar7);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar10 = vpmovsxwd_avx(auVar10);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar88 = vsubps_avx(auVar10,auVar272);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar10 = vpmovsxwd_avx(auVar7);
  auVar169._0_4_ = auVar271._0_4_ * auVar88._0_4_;
  auVar169._4_4_ = auVar271._4_4_ * auVar88._4_4_;
  auVar169._8_4_ = auVar271._8_4_ * auVar88._8_4_;
  auVar169._12_4_ = auVar271._12_4_ * auVar88._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar272);
  auVar190._0_4_ = auVar271._0_4_ * auVar10._0_4_;
  auVar190._4_4_ = auVar271._4_4_ * auVar10._4_4_;
  auVar190._8_4_ = auVar271._8_4_ * auVar10._8_4_;
  auVar190._12_4_ = auVar271._12_4_ * auVar10._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 * 0xe + 6);
  auVar10 = vpmovsxwd_avx(auVar88);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar7 = vsubps_avx(auVar10,auVar83);
  auVar114._1_3_ = 0;
  auVar114[0] = PVar3;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar271);
  auVar211._0_4_ = auVar250._0_4_ * auVar7._0_4_;
  auVar211._4_4_ = auVar250._4_4_ * auVar7._4_4_;
  auVar211._8_4_ = auVar250._8_4_ * auVar7._8_4_;
  auVar211._12_4_ = auVar250._12_4_ * auVar7._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar83);
  auVar113._0_4_ = auVar250._0_4_ * auVar10._0_4_;
  auVar113._4_4_ = auVar250._4_4_ * auVar10._4_4_;
  auVar113._8_4_ = auVar250._8_4_ * auVar10._8_4_;
  auVar113._12_4_ = auVar250._12_4_ * auVar10._12_4_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar72 * 0x15 + 6);
  auVar10 = vpmovsxwd_avx(auVar250);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar135);
  auVar152._0_4_ = auVar84._0_4_ * auVar10._0_4_;
  auVar152._4_4_ = auVar84._4_4_ * auVar10._4_4_;
  auVar152._8_4_ = auVar84._8_4_ * auVar10._8_4_;
  auVar152._12_4_ = auVar84._12_4_ * auVar10._12_4_;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar10 = vpmovsxwd_avx(auVar272);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar135);
  auVar83._0_4_ = auVar84._0_4_ * auVar10._0_4_;
  auVar83._4_4_ = auVar84._4_4_ * auVar10._4_4_;
  auVar83._8_4_ = auVar84._8_4_ * auVar10._8_4_;
  auVar83._12_4_ = auVar84._12_4_ * auVar10._12_4_;
  auVar10 = vpminsd_avx(auVar169,auVar190);
  auVar7 = vpminsd_avx(auVar211,auVar113);
  auVar10 = vmaxps_avx(auVar10,auVar7);
  auVar7 = vpminsd_avx(auVar152,auVar83);
  uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar245._4_4_ = uVar77;
  auVar245._0_4_ = uVar77;
  auVar245._8_4_ = uVar77;
  auVar245._12_4_ = uVar77;
  auVar7 = vmaxps_avx(auVar7,auVar245);
  auVar10 = vmaxps_avx(auVar10,auVar7);
  local_5c0._0_4_ = auVar10._0_4_ * 0.99999964;
  local_5c0._4_4_ = auVar10._4_4_ * 0.99999964;
  local_5c0._8_4_ = auVar10._8_4_ * 0.99999964;
  local_5c0._12_4_ = auVar10._12_4_ * 0.99999964;
  auVar10 = vpmaxsd_avx(auVar169,auVar190);
  auVar7 = vpmaxsd_avx(auVar211,auVar113);
  auVar10 = vminps_avx(auVar10,auVar7);
  auVar7 = vpmaxsd_avx(auVar152,auVar83);
  fVar187 = ray->tfar;
  auVar135._4_4_ = fVar187;
  auVar135._0_4_ = fVar187;
  auVar135._8_4_ = fVar187;
  auVar135._12_4_ = fVar187;
  auVar7 = vminps_avx(auVar7,auVar135);
  auVar10 = vminps_avx(auVar10,auVar7);
  auVar84._0_4_ = auVar10._0_4_ * 1.0000004;
  auVar84._4_4_ = auVar10._4_4_ * 1.0000004;
  auVar84._8_4_ = auVar10._8_4_ * 1.0000004;
  auVar84._12_4_ = auVar10._12_4_ * 1.0000004;
  auVar114[4] = PVar3;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar3;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar3;
  auVar114._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar114,_DAT_01f4ad30);
  auVar10 = vcmpps_avx(local_5c0,auVar84,2);
  auVar10 = vandps_avx(auVar10,auVar7);
  auVar123._16_16_ = mm_lookupmask_ps._240_16_;
  auVar123._0_16_ = mm_lookupmask_ps._240_16_;
  uVar77 = vmovmskps_avx(auVar10);
  local_808 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar77);
  local_320 = vblendps_avx(auVar123,ZEXT832(0) << 0x20,0x80);
LAB_01165349:
  if (local_808 == 0) {
LAB_011679e9:
    return local_808 != 0;
  }
  lVar73 = 0;
  for (uVar72 = local_808; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  uVar71 = *(uint *)(prim + 2);
  local_8a8 = (ulong)*(uint *)(prim + lVar73 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar71].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8a8);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar73 = *(long *)&pGVar4[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar73 + (long)p_Var5 * uVar72);
  auVar7 = *(undefined1 (*) [16])(lVar73 + (uVar72 + 1) * (long)p_Var5);
  local_810 = local_808 - 1 & local_808;
  if (local_810 != 0) {
    uVar76 = local_810 - 1 & local_810;
    for (uVar74 = local_810; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar191._0_4_ = (auVar10._0_4_ + auVar7._0_4_) * 0.5;
  auVar191._4_4_ = (auVar10._4_4_ + auVar7._4_4_) * 0.5;
  auVar191._8_4_ = (auVar10._8_4_ + auVar7._8_4_) * 0.5;
  auVar191._12_4_ = (auVar10._12_4_ + auVar7._12_4_) * 0.5;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar88 = vsubps_avx(auVar191,(undefined1  [16])aVar1);
  auVar88 = vdpps_avx(auVar88,(undefined1  [16])aVar2,0x7f);
  auVar271 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar250 = vrcpss_avx(auVar271,auVar271);
  auVar240 = ZEXT1664(auVar250);
  auVar271 = vfnmadd213ss_fma(auVar250,auVar271,ZEXT416(0x40000000));
  fVar187 = auVar88._0_4_ * auVar250._0_4_ * auVar271._0_4_;
  local_820 = ZEXT416((uint)fVar187);
  auVar192._4_4_ = fVar187;
  auVar192._0_4_ = fVar187;
  auVar192._8_4_ = fVar187;
  auVar192._12_4_ = fVar187;
  fStack_690 = fVar187;
  _local_6a0 = auVar192;
  fStack_68c = fVar187;
  fStack_688 = fVar187;
  fStack_684 = fVar187;
  auVar88 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar192);
  auVar88 = vblendps_avx(auVar88,_DAT_01f45a50,8);
  local_940 = vsubps_avx(auVar10,auVar88);
  local_950 = vsubps_avx(*(undefined1 (*) [16])(lVar73 + (uVar72 + 2) * (long)p_Var5),auVar88);
  local_960 = vsubps_avx(auVar7,auVar88);
  auVar217 = ZEXT1664(local_960);
  _local_970 = vsubps_avx(*(undefined1 (*) [16])(lVar73 + (uVar72 + 3) * (long)p_Var5),auVar88);
  auVar10 = vmovshdup_avx(local_940);
  uVar80 = auVar10._0_8_;
  auVar284._8_8_ = uVar80;
  auVar284._0_8_ = uVar80;
  auVar284._16_8_ = uVar80;
  auVar284._24_8_ = uVar80;
  auVar7 = vshufps_avx(local_940,local_940,0xaa);
  local_1e0 = auVar7._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar7 = vshufps_avx(local_940,local_940,0xff);
  local_200 = auVar7._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar7 = vmovshdup_avx(local_960);
  local_3a0 = auVar7._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar7 = vshufps_avx(local_960,local_960,0xaa);
  local_3c0 = auVar7._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar7 = vshufps_avx(local_960,local_960,0xff);
  local_3e0 = auVar7._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar7 = vmovshdup_avx(local_950);
  local_400 = auVar7._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar7 = vshufps_avx(local_950,local_950,0xaa);
  local_420 = auVar7._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar7 = vshufps_avx(local_950,local_950,0xff);
  local_440 = auVar7._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar7 = vmovshdup_avx(_local_970);
  local_460 = auVar7._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar7 = vshufps_avx(_local_970,_local_970,0xaa);
  local_480 = auVar7._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar7 = vshufps_avx(_local_970,_local_970,0xff);
  local_4a0 = auVar7._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar85._0_4_ = aVar2.x * aVar2.x;
  auVar85._4_4_ = aVar2.y * aVar2.y;
  auVar85._8_4_ = aVar2.z * aVar2.z;
  auVar85._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar7 = vshufps_avx(auVar85,auVar85,0xaa);
  uVar80 = auVar7._0_8_;
  auVar176._8_8_ = uVar80;
  auVar176._0_8_ = uVar80;
  auVar176._16_8_ = uVar80;
  auVar176._24_8_ = uVar80;
  uVar77 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_5e0._4_4_ = uVar77;
  local_5e0._0_4_ = uVar77;
  fStack_5d8 = (float)uVar77;
  fStack_5d4 = (float)uVar77;
  fStack_5d0 = (float)uVar77;
  fStack_5cc = (float)uVar77;
  fStack_5c8 = (float)uVar77;
  register0x0000135c = uVar77;
  auVar7 = vfmadd231ps_fma(auVar176,_local_5e0,_local_5e0);
  uVar77 = *(undefined4 *)&(ray->dir).field_0;
  local_6c0._4_4_ = uVar77;
  local_6c0._0_4_ = uVar77;
  fStack_6b8 = (float)uVar77;
  fStack_6b4 = (float)uVar77;
  fStack_6b0 = (float)uVar77;
  fStack_6ac = (float)uVar77;
  fStack_6a8 = (float)uVar77;
  register0x000013dc = uVar77;
  auVar231 = ZEXT3264(_local_6c0);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_6c0,_local_6c0);
  uVar72 = 0;
  bVar78 = 0;
  local_b04 = 1;
  local_6e0 = (ray->dir).field_0.m128[2];
  local_240 = local_940._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_4c0 = local_960._0_4_;
  uStack_4bc = local_4c0;
  uStack_4b8 = local_4c0;
  uStack_4b4 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4ac = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_4a4 = local_4c0;
  local_4e0 = local_950._0_4_;
  uStack_4dc = local_4e0;
  uStack_4d8 = local_4e0;
  uStack_4d4 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4cc = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4c4 = local_4e0;
  local_500 = local_970._0_4_;
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_720._8_4_ = 0x7fffffff;
  local_720._0_8_ = 0x7fffffff7fffffff;
  local_720._12_4_ = 0x7fffffff;
  local_720._16_4_ = 0x7fffffff;
  local_720._20_4_ = 0x7fffffff;
  local_720._24_4_ = 0x7fffffff;
  local_720._28_4_ = 0x7fffffff;
  local_520 = vandps_avx(ZEXT1632(auVar7),local_720);
  local_5b0 = ZEXT816(0x3f80000000000000);
  local_220 = ZEXT1632(auVar7);
  fStack_6dc = local_6e0;
  fStack_6d8 = local_6e0;
  fStack_6d4 = local_6e0;
  fStack_6d0 = local_6e0;
  fStack_6cc = local_6e0;
  fStack_6c8 = local_6e0;
  fStack_6c4 = local_6e0;
  do {
    auVar7 = vmovshdup_avx(local_5b0);
    auVar7 = vsubps_avx(auVar7,local_5b0);
    local_840._0_4_ = auVar7._0_4_;
    fVar167 = (float)local_840._0_4_ * 0.04761905;
    uVar77 = local_5b0._0_4_;
    local_880._4_4_ = uVar77;
    local_880._0_4_ = uVar77;
    local_880._8_4_ = uVar77;
    local_880._12_4_ = uVar77;
    local_880._16_4_ = uVar77;
    local_880._20_4_ = uVar77;
    local_880._24_4_ = uVar77;
    local_880._28_4_ = uVar77;
    local_840._4_4_ = local_840._0_4_;
    local_840._8_4_ = local_840._0_4_;
    local_840._12_4_ = local_840._0_4_;
    local_840._16_4_ = local_840._0_4_;
    local_840._20_4_ = local_840._0_4_;
    local_840._24_4_ = local_840._0_4_;
    local_840._28_4_ = local_840._0_4_;
    auVar7 = vfmadd231ps_fma(local_880,local_840,_DAT_01f7b040);
    auVar97._8_4_ = 0x3f800000;
    auVar97._0_8_ = 0x3f8000003f800000;
    auVar97._12_4_ = 0x3f800000;
    auVar97._16_4_ = 0x3f800000;
    auVar97._20_4_ = 0x3f800000;
    auVar97._24_4_ = 0x3f800000;
    auVar97._28_4_ = 0x3f800000;
    auVar123 = vsubps_avx(auVar97,ZEXT1632(auVar7));
    fVar187 = auVar7._0_4_;
    fVar205 = auVar7._4_4_;
    fVar207 = auVar7._8_4_;
    fVar209 = auVar7._12_4_;
    auVar232._28_36_ = auVar231._28_36_;
    auVar232._0_28_ =
         ZEXT1628(CONCAT412(fVar209 * fVar209,
                            CONCAT48(fVar207 * fVar207,CONCAT44(fVar205 * fVar205,fVar187 * fVar187)
                                    )));
    fVar233 = fVar187 * 3.0;
    fVar241 = fVar205 * 3.0;
    fVar242 = fVar207 * 3.0;
    fVar243 = fVar209 * 3.0;
    fVar204 = auVar123._0_4_;
    auVar256._0_4_ = fVar204 * fVar204;
    fVar206 = auVar123._4_4_;
    auVar256._4_4_ = fVar206 * fVar206;
    fVar208 = auVar123._8_4_;
    auVar256._8_4_ = fVar208 * fVar208;
    fVar183 = auVar123._12_4_;
    auVar256._12_4_ = fVar183 * fVar183;
    fVar184 = auVar123._16_4_;
    auVar256._16_4_ = fVar184 * fVar184;
    fVar185 = auVar123._20_4_;
    auVar256._20_4_ = fVar185 * fVar185;
    fVar186 = auVar123._24_4_;
    auVar256._28_36_ = auVar255._28_36_;
    auVar256._24_4_ = fVar186 * fVar186;
    fVar111 = auVar123._28_4_;
    auVar255._0_4_ = (auVar256._0_4_ * (fVar204 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar255._4_4_ = (auVar256._4_4_ * (fVar206 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar255._8_4_ = (auVar256._8_4_ * (fVar208 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar255._12_4_ = (auVar256._12_4_ * (fVar183 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar255._16_4_ = (auVar256._16_4_ * (fVar184 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar255._20_4_ = (auVar256._20_4_ * (fVar185 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar255._28_36_ = auVar266._28_36_;
    auVar255._24_4_ = (auVar256._24_4_ * (fVar186 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar123 = auVar255._0_32_;
    fVar210 = fVar187 * fVar187 * -fVar204 * 0.5;
    fVar218 = fVar205 * fVar205 * -fVar206 * 0.5;
    fVar219 = fVar207 * fVar207 * -fVar208 * 0.5;
    fVar220 = fVar209 * fVar209 * -fVar183 * 0.5;
    fVar221 = -fVar184 * 0.0 * 0.0 * 0.5;
    fVar222 = -fVar185 * 0.0 * 0.0 * 0.5;
    fVar223 = -fVar186 * 0.0 * 0.0 * 0.5;
    auVar68._4_4_ = fVar218 * fStack_4fc;
    auVar68._0_4_ = fVar210 * local_500;
    auVar68._8_4_ = fVar219 * fStack_4f8;
    auVar68._12_4_ = fVar220 * fStack_4f4;
    auVar68._16_4_ = fVar221 * fStack_4f0;
    auVar68._20_4_ = fVar222 * fStack_4ec;
    auVar68._24_4_ = fVar223 * fStack_4e8;
    auVar68._28_4_ = DAT_01f7b040._28_4_;
    auVar280._0_4_ = fVar210 * (float)local_460;
    auVar280._4_4_ = fVar218 * local_460._4_4_;
    auVar280._8_4_ = fVar219 * (float)uStack_458;
    auVar280._12_4_ = fVar220 * uStack_458._4_4_;
    auVar280._16_4_ = fVar221 * (float)uStack_450;
    auVar280._20_4_ = fVar222 * uStack_450._4_4_;
    auVar280._28_36_ = auVar279._28_36_;
    auVar280._24_4_ = fVar223 * (float)uStack_448;
    auVar265._4_4_ = fVar218 * local_480._4_4_;
    auVar265._0_4_ = fVar210 * (float)local_480;
    auVar265._8_4_ = fVar219 * (float)uStack_478;
    auVar265._12_4_ = fVar220 * uStack_478._4_4_;
    auVar265._16_4_ = fVar221 * (float)uStack_470;
    auVar265._20_4_ = fVar222 * uStack_470._4_4_;
    auVar265._24_4_ = fVar223 * (float)uStack_468;
    auVar265._28_4_ = 0x40000000;
    auVar6._4_4_ = fVar218 * local_4a0._4_4_;
    auVar6._0_4_ = fVar210 * (float)local_4a0;
    auVar6._8_4_ = fVar219 * (float)uStack_498;
    auVar6._12_4_ = fVar220 * uStack_498._4_4_;
    auVar6._16_4_ = fVar221 * (float)uStack_490;
    auVar6._20_4_ = fVar222 * uStack_490._4_4_;
    auVar6._24_4_ = fVar223 * (float)uStack_488;
    auVar6._28_4_ = auVar217._28_4_;
    auVar46._4_4_ = uStack_4dc;
    auVar46._0_4_ = local_4e0;
    auVar46._8_4_ = uStack_4d8;
    auVar46._12_4_ = uStack_4d4;
    auVar46._16_4_ = uStack_4d0;
    auVar46._20_4_ = uStack_4cc;
    auVar46._24_4_ = uStack_4c8;
    auVar46._28_4_ = uStack_4c4;
    auVar7 = vfmadd231ps_fma(auVar68,auVar123,auVar46);
    auVar54._8_8_ = uStack_3f8;
    auVar54._0_8_ = local_400;
    auVar54._16_8_ = uStack_3f0;
    auVar54._24_8_ = uStack_3e8;
    auVar88 = vfmadd231ps_fma(auVar280._0_32_,auVar123,auVar54);
    auVar52._8_8_ = uStack_418;
    auVar52._0_8_ = local_420;
    auVar52._16_8_ = uStack_410;
    auVar52._24_8_ = uStack_408;
    auVar271 = vfmadd231ps_fma(auVar265,auVar123,auVar52);
    auVar50._8_8_ = uStack_438;
    auVar50._0_8_ = local_440;
    auVar50._16_8_ = uStack_430;
    auVar50._24_8_ = uStack_428;
    auVar250 = vfmadd231ps_fma(auVar6,auVar123,auVar50);
    auVar8._4_4_ = ((fVar241 + -5.0) * fVar205 * fVar205 + 2.0) * 0.5;
    auVar8._0_4_ = ((fVar233 + -5.0) * fVar187 * fVar187 + 2.0) * 0.5;
    auVar8._8_4_ = ((fVar242 + -5.0) * fVar207 * fVar207 + 2.0) * 0.5;
    auVar8._12_4_ = ((fVar243 + -5.0) * fVar209 * fVar209 + 2.0) * 0.5;
    auVar8._16_4_ = 0x3f800000;
    auVar8._20_4_ = 0x3f800000;
    auVar8._24_4_ = 0x3f800000;
    auVar8._28_4_ = auVar266._28_4_ + 2.0;
    auVar48._4_4_ = uStack_4bc;
    auVar48._0_4_ = local_4c0;
    auVar48._8_4_ = uStack_4b8;
    auVar48._12_4_ = uStack_4b4;
    auVar48._16_4_ = uStack_4b0;
    auVar48._20_4_ = uStack_4ac;
    auVar48._24_4_ = uStack_4a8;
    auVar48._28_4_ = uStack_4a4;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar8,auVar48);
    auVar60._8_8_ = uStack_398;
    auVar60._0_8_ = local_3a0;
    auVar60._16_8_ = uStack_390;
    auVar60._24_8_ = uStack_388;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar8,auVar60);
    auVar58._8_8_ = uStack_3b8;
    auVar58._0_8_ = local_3c0;
    auVar58._16_8_ = uStack_3b0;
    auVar58._24_8_ = uStack_3a8;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar8,auVar58);
    auVar56._8_8_ = uStack_3d8;
    auVar56._0_8_ = local_3e0;
    auVar56._16_8_ = uStack_3d0;
    auVar56._24_8_ = uStack_3c8;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar8,auVar56);
    auVar104._4_4_ = -fVar205 * fVar206 * fVar206 * 0.5;
    auVar104._0_4_ = -fVar187 * fVar204 * fVar204 * 0.5;
    auVar104._8_4_ = -fVar207 * fVar208 * fVar208 * 0.5;
    auVar104._12_4_ = -fVar209 * fVar183 * fVar183 * 0.5;
    auVar104._16_4_ = fVar184 * -0.0 * fVar184 * 0.5;
    auVar104._20_4_ = fVar185 * -0.0 * fVar185 * 0.5;
    auVar104._24_4_ = fVar186 * -0.0 * fVar186 * 0.5;
    auVar104._28_4_ = 0x80000000;
    auVar64._4_4_ = uStack_23c;
    auVar64._0_4_ = local_240;
    auVar64._8_4_ = uStack_238;
    auVar64._12_4_ = uStack_234;
    auVar64._16_4_ = uStack_230;
    auVar64._20_4_ = uStack_22c;
    auVar64._24_4_ = uStack_228;
    auVar64._28_4_ = uStack_224;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar104,auVar64);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar104,auVar284);
    auVar66._8_8_ = uStack_1d8;
    auVar66._0_8_ = local_1e0;
    auVar66._16_8_ = uStack_1d0;
    auVar66._24_8_ = uStack_1c8;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar104,auVar66);
    auVar65._8_8_ = uStack_1f8;
    auVar65._0_8_ = local_200;
    auVar65._16_8_ = uStack_1f0;
    auVar65._24_8_ = uStack_1e8;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar65,auVar104);
    auVar195._0_4_ = (fVar204 + fVar204) * fVar187;
    auVar195._4_4_ = (fVar206 + fVar206) * fVar205;
    auVar195._8_4_ = (fVar208 + fVar208) * fVar207;
    auVar195._12_4_ = (fVar183 + fVar183) * fVar209;
    auVar195._16_4_ = (fVar184 + fVar184) * 0.0;
    auVar195._20_4_ = (fVar185 + fVar185) * 0.0;
    auVar195._24_4_ = (fVar186 + fVar186) * 0.0;
    auVar195._28_4_ = 0;
    auVar123 = vsubps_avx(auVar195,auVar256._0_32_);
    fVar210 = auVar240._28_4_ + 2.0;
    auVar127._4_4_ = (fVar206 + fVar206) * (fVar241 + 2.0);
    auVar127._0_4_ = (fVar204 + fVar204) * (fVar233 + 2.0);
    auVar127._8_4_ = (fVar208 + fVar208) * (fVar242 + 2.0);
    auVar127._12_4_ = (fVar183 + fVar183) * (fVar243 + 2.0);
    auVar127._16_4_ = (fVar184 + fVar184) * 2.0;
    auVar127._20_4_ = (fVar185 + fVar185) * 2.0;
    auVar127._24_4_ = (fVar186 + fVar186) * 2.0;
    auVar127._28_4_ = fVar210;
    auVar145._4_4_ = fVar206 * fVar206 * 3.0;
    auVar145._0_4_ = fVar204 * fVar204 * 3.0;
    auVar145._8_4_ = fVar208 * fVar208 * 3.0;
    auVar145._12_4_ = fVar183 * fVar183 * 3.0;
    auVar145._16_4_ = fVar184 * fVar184 * 3.0;
    auVar145._20_4_ = fVar185 * fVar185 * 3.0;
    auVar145._24_4_ = fVar186 * fVar186 * 3.0;
    auVar145._28_4_ = fVar111;
    auVar176 = vsubps_avx(auVar127,auVar145);
    auVar265 = vsubps_avx(auVar232._0_32_,auVar195);
    auVar179._4_4_ = auVar123._4_4_ * 0.5;
    auVar179._0_4_ = auVar123._0_4_ * 0.5;
    auVar179._8_4_ = auVar123._8_4_ * 0.5;
    auVar179._12_4_ = auVar123._12_4_ * 0.5;
    auVar179._16_4_ = auVar123._16_4_ * 0.5;
    auVar179._20_4_ = auVar123._20_4_ * 0.5;
    auVar179._24_4_ = auVar123._24_4_ * 0.5;
    auVar179._28_4_ = auVar231._28_4_;
    auVar12._28_4_ = fVar210;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412((fVar243 * fVar209 + (fVar209 + fVar209) * (fVar243 + -5.0)) * 0.5,
                            CONCAT48((fVar242 * fVar207 + (fVar207 + fVar207) * (fVar242 + -5.0)) *
                                     0.5,CONCAT44((fVar241 * fVar205 +
                                                  (fVar205 + fVar205) * (fVar241 + -5.0)) * 0.5,
                                                  (fVar233 * fVar187 +
                                                  (fVar187 + fVar187) * (fVar233 + -5.0)) * 0.5))));
    auVar142._4_4_ = auVar176._4_4_ * 0.5;
    auVar142._0_4_ = auVar176._0_4_ * 0.5;
    auVar142._8_4_ = auVar176._8_4_ * 0.5;
    auVar142._12_4_ = auVar176._12_4_ * 0.5;
    auVar142._16_4_ = auVar176._16_4_ * 0.5;
    auVar142._20_4_ = auVar176._20_4_ * 0.5;
    auVar142._24_4_ = auVar176._24_4_ * 0.5;
    auVar142._28_4_ = auVar176._28_4_;
    fVar187 = auVar265._0_4_ * 0.5;
    fVar204 = auVar265._4_4_ * 0.5;
    fVar205 = auVar265._8_4_ * 0.5;
    fVar206 = auVar265._12_4_ * 0.5;
    fVar207 = auVar265._16_4_ * 0.5;
    fVar208 = auVar265._20_4_ * 0.5;
    fVar209 = auVar265._24_4_ * 0.5;
    auVar198._4_4_ = fVar204 * fStack_4fc;
    auVar198._0_4_ = fVar187 * local_500;
    auVar198._8_4_ = fVar205 * fStack_4f8;
    auVar198._12_4_ = fVar206 * fStack_4f4;
    auVar198._16_4_ = fVar207 * fStack_4f0;
    auVar198._20_4_ = fVar208 * fStack_4ec;
    auVar198._24_4_ = fVar209 * fStack_4e8;
    auVar198._28_4_ = 0x3f000000;
    auVar213._4_4_ = fVar204 * local_460._4_4_;
    auVar213._0_4_ = fVar187 * (float)local_460;
    auVar213._8_4_ = fVar205 * (float)uStack_458;
    auVar213._12_4_ = fVar206 * uStack_458._4_4_;
    auVar213._16_4_ = fVar207 * (float)uStack_450;
    auVar213._20_4_ = fVar208 * uStack_450._4_4_;
    auVar213._24_4_ = fVar209 * (float)uStack_448;
    auVar213._28_4_ = auVar123._28_4_;
    auVar258._4_4_ = fVar204 * local_480._4_4_;
    auVar258._0_4_ = fVar187 * (float)local_480;
    auVar258._8_4_ = fVar205 * (float)uStack_478;
    auVar258._12_4_ = fVar206 * uStack_478._4_4_;
    auVar258._16_4_ = fVar207 * (float)uStack_470;
    auVar258._20_4_ = fVar208 * uStack_470._4_4_;
    auVar258._24_4_ = fVar209 * (float)uStack_468;
    auVar258._28_4_ = auVar240._28_4_ + -5.0 + 0.0;
    auVar273._4_4_ = fVar204 * local_4a0._4_4_;
    auVar273._0_4_ = fVar187 * (float)local_4a0;
    auVar273._8_4_ = fVar205 * (float)uStack_498;
    auVar273._12_4_ = fVar206 * uStack_498._4_4_;
    auVar273._16_4_ = fVar207 * (float)uStack_490;
    auVar273._20_4_ = fVar208 * uStack_490._4_4_;
    auVar273._24_4_ = fVar209 * (float)uStack_488;
    auVar273._28_4_ = fVar111 + fVar111;
    auVar47._4_4_ = uStack_4dc;
    auVar47._0_4_ = local_4e0;
    auVar47._8_4_ = uStack_4d8;
    auVar47._12_4_ = uStack_4d4;
    auVar47._16_4_ = uStack_4d0;
    auVar47._20_4_ = uStack_4cc;
    auVar47._24_4_ = uStack_4c8;
    auVar47._28_4_ = uStack_4c4;
    auVar272 = vfmadd231ps_fma(auVar198,auVar142,auVar47);
    auVar55._8_8_ = uStack_3f8;
    auVar55._0_8_ = local_400;
    auVar55._16_8_ = uStack_3f0;
    auVar55._24_8_ = uStack_3e8;
    auVar84 = vfmadd231ps_fma(auVar213,auVar142,auVar55);
    auVar53._8_8_ = uStack_418;
    auVar53._0_8_ = local_420;
    auVar53._16_8_ = uStack_410;
    auVar53._24_8_ = uStack_408;
    auVar83 = vfmadd231ps_fma(auVar258,auVar142,auVar53);
    auVar51._8_8_ = uStack_438;
    auVar51._0_8_ = local_440;
    auVar51._16_8_ = uStack_430;
    auVar51._24_8_ = uStack_428;
    auVar135 = vfmadd231ps_fma(auVar273,auVar142,auVar51);
    auVar49._4_4_ = uStack_4bc;
    auVar49._0_4_ = local_4c0;
    auVar49._8_4_ = uStack_4b8;
    auVar49._12_4_ = uStack_4b4;
    auVar49._16_4_ = uStack_4b0;
    auVar49._20_4_ = uStack_4ac;
    auVar49._24_4_ = uStack_4a8;
    auVar49._28_4_ = uStack_4a4;
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar272),auVar12,auVar49);
    auVar61._8_8_ = uStack_398;
    auVar61._0_8_ = local_3a0;
    auVar61._16_8_ = uStack_390;
    auVar61._24_8_ = uStack_388;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar12,auVar61);
    auVar59._8_8_ = uStack_3b8;
    auVar59._0_8_ = local_3c0;
    auVar59._16_8_ = uStack_3b0;
    auVar59._24_8_ = uStack_3a8;
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar12,auVar59);
    auVar57._8_8_ = uStack_3d8;
    auVar57._0_8_ = local_3e0;
    auVar57._16_8_ = uStack_3d0;
    auVar57._24_8_ = uStack_3c8;
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar12,auVar57);
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar272),auVar179,auVar64);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar179,auVar284);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar179,auVar66);
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar65,auVar179);
    fVar207 = auVar272._0_4_ * fVar167;
    fVar208 = auVar272._4_4_ * fVar167;
    local_900._4_4_ = fVar208;
    local_900._0_4_ = fVar207;
    fVar209 = auVar272._8_4_ * fVar167;
    local_900._8_4_ = fVar209;
    fVar223 = auVar272._12_4_ * fVar167;
    local_900._12_4_ = fVar223;
    local_900._16_4_ = fVar167 * 0.0;
    local_900._20_4_ = fVar167 * 0.0;
    local_900._24_4_ = fVar167 * 0.0;
    local_900._28_4_ = auVar10._4_4_;
    local_9e0._0_4_ = auVar84._0_4_ * fVar167;
    local_9e0._4_4_ = auVar84._4_4_ * fVar167;
    local_9e0._8_4_ = auVar84._8_4_ * fVar167;
    local_9e0._12_4_ = auVar84._12_4_ * fVar167;
    local_9e0._16_4_ = fVar167 * 0.0;
    local_9e0._20_4_ = fVar167 * 0.0;
    local_9e0._24_4_ = fVar167 * 0.0;
    local_9e0._28_4_ = 0;
    fVar111 = auVar83._0_4_ * fVar167;
    fVar210 = auVar83._4_4_ * fVar167;
    local_780._4_4_ = fVar210;
    local_780._0_4_ = fVar111;
    fVar218 = auVar83._8_4_ * fVar167;
    local_780._8_4_ = fVar218;
    fVar219 = auVar83._12_4_ * fVar167;
    local_780._12_4_ = fVar219;
    fVar220 = fVar167 * 0.0;
    local_780._16_4_ = fVar220;
    fVar221 = fVar167 * 0.0;
    local_780._20_4_ = fVar221;
    fVar222 = fVar167 * 0.0;
    local_780._24_4_ = fVar222;
    local_780._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    fVar187 = auVar135._0_4_ * fVar167;
    fVar204 = auVar135._4_4_ * fVar167;
    auVar285._4_4_ = fVar204;
    auVar285._0_4_ = fVar187;
    fVar205 = auVar135._8_4_ * fVar167;
    auVar285._8_4_ = fVar205;
    fVar206 = auVar135._12_4_ * fVar167;
    auVar285._12_4_ = fVar206;
    auVar285._16_4_ = fVar167 * 0.0;
    auVar285._20_4_ = fVar167 * 0.0;
    auVar285._24_4_ = fVar167 * 0.0;
    auVar285._28_4_ = fVar167;
    local_a60 = ZEXT1632(auVar7);
    _local_860 = vpermps_avx2(_DAT_01fb7720,local_a60);
    auVar273 = ZEXT1632(auVar271);
    local_9c0 = vpermps_avx2(_DAT_01fb7720,auVar273);
    local_2a0 = vsubps_avx(_local_860,ZEXT1632(auVar7));
    local_280 = vsubps_avx(local_9c0,ZEXT1632(auVar271));
    fVar183 = local_280._0_4_;
    fVar184 = local_280._4_4_;
    auVar9._4_4_ = fVar184 * fVar208;
    auVar9._0_4_ = fVar183 * fVar207;
    fVar185 = local_280._8_4_;
    auVar9._8_4_ = fVar185 * fVar209;
    fVar186 = local_280._12_4_;
    auVar9._12_4_ = fVar186 * fVar223;
    fVar243 = local_280._16_4_;
    auVar9._16_4_ = fVar243 * fVar167 * 0.0;
    fVar166 = local_280._20_4_;
    auVar9._20_4_ = fVar166 * fVar167 * 0.0;
    fVar257 = local_280._24_4_;
    auVar9._24_4_ = fVar257 * fVar167 * 0.0;
    auVar9._28_4_ = auVar231._28_4_;
    auVar7 = vfmsub231ps_fma(auVar9,local_780,local_2a0);
    local_260 = ZEXT1632(auVar88);
    local_760 = vpermps_avx2(_DAT_01fb7720,local_260);
    local_2c0 = vsubps_avx(local_760,ZEXT1632(auVar88));
    fVar261 = local_2a0._0_4_;
    fVar262 = local_2a0._4_4_;
    auVar11._4_4_ = fVar262 * local_9e0._4_4_;
    auVar11._0_4_ = fVar261 * (float)local_9e0._0_4_;
    fVar263 = local_2a0._8_4_;
    auVar11._8_4_ = fVar263 * local_9e0._8_4_;
    fVar267 = local_2a0._12_4_;
    auVar11._12_4_ = fVar267 * local_9e0._12_4_;
    fVar268 = local_2a0._16_4_;
    auVar11._16_4_ = fVar268 * local_9e0._16_4_;
    fVar269 = local_2a0._20_4_;
    auVar11._20_4_ = fVar269 * local_9e0._20_4_;
    fVar270 = local_2a0._24_4_;
    auVar11._24_4_ = fVar270 * local_9e0._24_4_;
    auVar11._28_4_ = local_760._28_4_;
    auVar88 = vfmsub231ps_fma(auVar11,local_900,local_2c0);
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar88._12_4_ * auVar88._12_4_,
                                                CONCAT48(auVar88._8_4_ * auVar88._8_4_,
                                                         CONCAT44(auVar88._4_4_ * auVar88._4_4_,
                                                                  auVar88._0_4_ * auVar88._0_4_)))),
                             ZEXT1632(auVar7),ZEXT1632(auVar7));
    fVar223 = local_2c0._0_4_;
    auVar227._0_4_ = fVar223 * fVar111;
    fVar233 = local_2c0._4_4_;
    auVar227._4_4_ = fVar233 * fVar210;
    fVar241 = local_2c0._8_4_;
    auVar227._8_4_ = fVar241 * fVar218;
    fVar242 = local_2c0._12_4_;
    auVar227._12_4_ = fVar242 * fVar219;
    fVar281 = local_2c0._16_4_;
    auVar227._16_4_ = fVar281 * fVar220;
    fVar282 = local_2c0._20_4_;
    auVar227._20_4_ = fVar282 * fVar221;
    fVar283 = local_2c0._24_4_;
    auVar227._24_4_ = fVar283 * fVar222;
    auVar227._28_4_ = 0;
    auVar88 = vfmsub231ps_fma(auVar227,local_9e0,local_280);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar88),ZEXT1632(auVar88));
    auVar228._0_4_ = fVar183 * fVar183;
    auVar228._4_4_ = fVar184 * fVar184;
    auVar228._8_4_ = fVar185 * fVar185;
    auVar228._12_4_ = fVar186 * fVar186;
    auVar228._16_4_ = fVar243 * fVar243;
    auVar228._20_4_ = fVar166 * fVar166;
    auVar228._24_4_ = fVar257 * fVar257;
    auVar228._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar228,local_2c0,local_2c0);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar7),local_2a0,local_2a0);
    auVar123 = vrcpps_avx(ZEXT1632(auVar271));
    auVar196._8_4_ = 0x3f800000;
    auVar196._0_8_ = 0x3f8000003f800000;
    auVar196._12_4_ = 0x3f800000;
    auVar196._16_4_ = 0x3f800000;
    auVar196._20_4_ = 0x3f800000;
    auVar196._24_4_ = 0x3f800000;
    auVar196._28_4_ = 0x3f800000;
    auVar7 = vfnmadd213ps_fma(auVar123,ZEXT1632(auVar271),auVar196);
    auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar123,auVar123);
    auVar179 = vpermps_avx2(_DAT_01fb7720,local_900);
    local_a20 = vpermps_avx2(_DAT_01fb7720,local_780);
    auVar14._4_4_ = fVar184 * auVar179._4_4_;
    auVar14._0_4_ = fVar183 * auVar179._0_4_;
    auVar14._8_4_ = fVar185 * auVar179._8_4_;
    auVar14._12_4_ = fVar186 * auVar179._12_4_;
    auVar14._16_4_ = fVar243 * auVar179._16_4_;
    auVar14._20_4_ = fVar166 * auVar179._20_4_;
    auVar14._24_4_ = fVar257 * auVar179._24_4_;
    auVar14._28_4_ = auVar123._28_4_;
    auVar272 = vfmsub231ps_fma(auVar14,local_a20,local_2a0);
    local_a40 = vpermps_avx2(_DAT_01fb7720,local_9e0);
    auVar15._4_4_ = fVar262 * local_a40._4_4_;
    auVar15._0_4_ = fVar261 * local_a40._0_4_;
    auVar15._8_4_ = fVar263 * local_a40._8_4_;
    auVar15._12_4_ = fVar267 * local_a40._12_4_;
    auVar15._16_4_ = fVar268 * local_a40._16_4_;
    auVar15._20_4_ = fVar269 * local_a40._20_4_;
    auVar15._24_4_ = fVar270 * local_a40._24_4_;
    auVar15._28_4_ = 0;
    auVar84 = vfmsub231ps_fma(auVar15,auVar179,local_2c0);
    auVar272 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar84._12_4_ * auVar84._12_4_,
                                                  CONCAT48(auVar84._8_4_ * auVar84._8_4_,
                                                           CONCAT44(auVar84._4_4_ * auVar84._4_4_,
                                                                    auVar84._0_4_ * auVar84._0_4_)))
                                       ),ZEXT1632(auVar272),ZEXT1632(auVar272));
    auVar235._0_4_ = fVar223 * local_a20._0_4_;
    auVar235._4_4_ = fVar233 * local_a20._4_4_;
    auVar235._8_4_ = fVar241 * local_a20._8_4_;
    auVar235._12_4_ = fVar242 * local_a20._12_4_;
    auVar235._16_4_ = fVar281 * local_a20._16_4_;
    auVar235._20_4_ = fVar282 * local_a20._20_4_;
    auVar235._24_4_ = fVar283 * local_a20._24_4_;
    auVar235._28_4_ = 0;
    auVar84 = vfmsub231ps_fma(auVar235,local_a40,local_280);
    auVar272 = vfmadd231ps_fma(ZEXT1632(auVar272),ZEXT1632(auVar84),ZEXT1632(auVar84));
    auVar123 = vmaxps_avx(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar88._12_4_,
                                             CONCAT48(auVar7._8_4_ * auVar88._8_4_,
                                                      CONCAT44(auVar7._4_4_ * auVar88._4_4_,
                                                               auVar7._0_4_ * auVar88._0_4_)))),
                          ZEXT1632(CONCAT412(auVar272._12_4_ * auVar7._12_4_,
                                             CONCAT48(auVar272._8_4_ * auVar7._8_4_,
                                                      CONCAT44(auVar272._4_4_ * auVar7._4_4_,
                                                               auVar272._0_4_ * auVar7._0_4_)))));
    local_7a0._0_4_ = auVar250._0_4_ + fVar187;
    local_7a0._4_4_ = auVar250._4_4_ + fVar204;
    local_7a0._8_4_ = auVar250._8_4_ + fVar205;
    local_7a0._12_4_ = auVar250._12_4_ + fVar206;
    local_7a0._16_4_ = fVar167 * 0.0 + 0.0;
    local_7a0._20_4_ = fVar167 * 0.0 + 0.0;
    local_7a0._24_4_ = fVar167 * 0.0 + 0.0;
    local_7a0._28_4_ = fVar167 + 0.0;
    auVar213 = ZEXT1632(auVar250);
    auVar176 = vsubps_avx(auVar213,auVar285);
    local_7c0 = vpermps_avx2(_DAT_01fb7720,auVar176);
    auVar12 = vpermps_avx2(_DAT_01fb7720,auVar213);
    auVar176 = vmaxps_avx(auVar213,local_7a0);
    auVar265 = vmaxps_avx(local_7c0,auVar12);
    auVar6 = vmaxps_avx(auVar176,auVar265);
    auVar176 = vrsqrtps_avx(ZEXT1632(auVar271));
    fVar187 = auVar176._0_4_;
    fVar204 = auVar176._4_4_;
    fVar205 = auVar176._8_4_;
    fVar206 = auVar176._12_4_;
    fVar207 = auVar176._16_4_;
    fVar208 = auVar176._20_4_;
    fVar209 = auVar176._24_4_;
    auVar214._0_4_ = fVar187 * fVar187 * fVar187 * auVar271._0_4_ * -0.5;
    auVar214._4_4_ = fVar204 * fVar204 * fVar204 * auVar271._4_4_ * -0.5;
    auVar214._8_4_ = fVar205 * fVar205 * fVar205 * auVar271._8_4_ * -0.5;
    auVar214._12_4_ = fVar206 * fVar206 * fVar206 * auVar271._12_4_ * -0.5;
    auVar214._16_4_ = fVar207 * fVar207 * fVar207 * -0.0;
    auVar214._20_4_ = fVar208 * fVar208 * fVar208 * -0.0;
    auVar214._24_4_ = fVar209 * fVar209 * fVar209 * -0.0;
    auVar214._28_4_ = 0;
    auVar197._8_4_ = 0x3fc00000;
    auVar197._0_8_ = 0x3fc000003fc00000;
    auVar197._12_4_ = 0x3fc00000;
    auVar197._16_4_ = 0x3fc00000;
    auVar197._20_4_ = 0x3fc00000;
    auVar197._24_4_ = 0x3fc00000;
    auVar197._28_4_ = 0x3fc00000;
    auVar7 = vfmadd231ps_fma(auVar214,auVar197,auVar176);
    auVar217 = ZEXT1664(auVar7);
    fVar187 = auVar7._0_4_;
    fVar205 = auVar7._4_4_;
    auVar16._4_4_ = fVar233 * fVar205;
    auVar16._0_4_ = fVar223 * fVar187;
    fVar207 = auVar7._8_4_;
    auVar16._8_4_ = fVar241 * fVar207;
    fVar209 = auVar7._12_4_;
    auVar16._12_4_ = fVar242 * fVar209;
    auVar16._16_4_ = fVar281 * 0.0;
    auVar16._20_4_ = fVar282 * 0.0;
    auVar16._24_4_ = fVar283 * 0.0;
    auVar16._28_4_ = 0;
    auVar17._4_4_ = fStack_6dc * fVar184 * fVar205;
    auVar17._0_4_ = local_6e0 * fVar183 * fVar187;
    auVar17._8_4_ = fStack_6d8 * fVar185 * fVar207;
    auVar17._12_4_ = fStack_6d4 * fVar186 * fVar209;
    auVar17._16_4_ = fStack_6d0 * fVar243 * 0.0;
    auVar17._20_4_ = fStack_6cc * fVar166 * 0.0;
    auVar17._24_4_ = fStack_6c8 * fVar257 * 0.0;
    auVar17._28_4_ = local_280._28_4_;
    auVar88 = vfmadd231ps_fma(auVar17,auVar16,_local_5e0);
    auVar176 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar104 = vsubps_avx(auVar176,auVar273);
    fVar167 = auVar104._0_4_;
    fVar223 = auVar104._4_4_;
    auVar18._4_4_ = fVar223 * fVar184 * fVar205;
    auVar18._0_4_ = fVar167 * fVar183 * fVar187;
    fVar233 = auVar104._8_4_;
    auVar18._8_4_ = fVar233 * fVar185 * fVar207;
    fVar241 = auVar104._12_4_;
    auVar18._12_4_ = fVar241 * fVar186 * fVar209;
    fVar242 = auVar104._16_4_;
    auVar18._16_4_ = fVar242 * fVar243 * 0.0;
    fVar243 = auVar104._20_4_;
    auVar18._20_4_ = fVar243 * fVar166 * 0.0;
    fVar166 = auVar104._24_4_;
    auVar18._24_4_ = fVar166 * fVar257 * 0.0;
    auVar18._28_4_ = local_a40._28_4_;
    auVar265 = vsubps_avx(auVar176,local_260);
    auVar271 = vfmadd231ps_fma(auVar18,auVar265,auVar16);
    local_8a0 = ZEXT1632(auVar7);
    auVar19._4_4_ = fVar262 * fVar205;
    auVar19._0_4_ = fVar261 * fVar187;
    auVar19._8_4_ = fVar263 * fVar207;
    auVar19._12_4_ = fVar267 * fVar209;
    auVar19._16_4_ = fVar268 * 0.0;
    auVar19._20_4_ = fVar269 * 0.0;
    auVar19._24_4_ = fVar270 * 0.0;
    auVar19._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar19,_local_6c0);
    auVar198 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar176 = vsubps_avx(auVar198,local_a60);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar176,auVar19);
    auVar8 = vsqrtps_avx(auVar123);
    auVar20._4_4_ = fStack_6dc * fVar223;
    auVar20._0_4_ = local_6e0 * fVar167;
    auVar20._8_4_ = fStack_6d8 * fVar233;
    auVar20._12_4_ = fStack_6d4 * fVar241;
    auVar20._16_4_ = fStack_6d0 * fVar242;
    auVar20._20_4_ = fStack_6cc * fVar243;
    auVar20._24_4_ = fStack_6c8 * fVar166;
    auVar20._28_4_ = auVar123._28_4_;
    auVar271 = vfmadd231ps_fma(auVar20,_local_5e0,auVar265);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),_local_6c0,auVar176);
    fVar204 = auVar88._0_4_;
    fVar257 = auVar7._0_4_;
    fVar206 = auVar88._4_4_;
    fVar261 = auVar7._4_4_;
    fVar208 = auVar88._8_4_;
    fVar262 = auVar7._8_4_;
    fVar183 = auVar88._12_4_;
    fVar263 = auVar7._12_4_;
    auVar123 = vsubps_avx(ZEXT1632(auVar271),
                          ZEXT1632(CONCAT412(fVar263 * fVar183,
                                             CONCAT48(fVar262 * fVar208,
                                                      CONCAT44(fVar261 * fVar206,fVar257 * fVar204))
                                            )));
    auVar21._4_4_ = fVar223 * fVar223;
    auVar21._0_4_ = fVar167 * fVar167;
    auVar21._8_4_ = fVar233 * fVar233;
    auVar21._12_4_ = fVar241 * fVar241;
    auVar21._16_4_ = fVar242 * fVar242;
    auVar21._20_4_ = fVar243 * fVar243;
    auVar21._24_4_ = fVar166 * fVar166;
    auVar21._28_4_ = 0;
    auVar271 = vfmadd231ps_fma(auVar21,auVar265,auVar265);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar176,auVar176);
    auVar127 = vsubps_avx(ZEXT1632(auVar271),
                          ZEXT1632(CONCAT412(fVar183 * fVar183,
                                             CONCAT48(fVar208 * fVar208,
                                                      CONCAT44(fVar206 * fVar206,fVar204 * fVar204))
                                            )));
    fVar204 = (auVar8._0_4_ + auVar6._0_4_) * 1.0000002;
    fVar206 = (auVar8._4_4_ + auVar6._4_4_) * 1.0000002;
    fVar208 = (auVar8._8_4_ + auVar6._8_4_) * 1.0000002;
    fVar183 = (auVar8._12_4_ + auVar6._12_4_) * 1.0000002;
    fVar184 = (auVar8._16_4_ + auVar6._16_4_) * 1.0000002;
    fVar185 = (auVar8._20_4_ + auVar6._20_4_) * 1.0000002;
    fVar186 = (auVar8._24_4_ + auVar6._24_4_) * 1.0000002;
    auVar22._4_4_ = fVar206 * fVar206;
    auVar22._0_4_ = fVar204 * fVar204;
    auVar22._8_4_ = fVar208 * fVar208;
    auVar22._12_4_ = fVar183 * fVar183;
    auVar22._16_4_ = fVar184 * fVar184;
    auVar22._20_4_ = fVar185 * fVar185;
    auVar22._24_4_ = fVar186 * fVar186;
    auVar22._28_4_ = auVar8._28_4_ + auVar6._28_4_;
    local_2e0._0_4_ = auVar123._0_4_ + auVar123._0_4_;
    local_2e0._4_4_ = auVar123._4_4_ + auVar123._4_4_;
    local_2e0._8_4_ = auVar123._8_4_ + auVar123._8_4_;
    local_2e0._12_4_ = auVar123._12_4_ + auVar123._12_4_;
    local_2e0._16_4_ = auVar123._16_4_ + auVar123._16_4_;
    local_2e0._20_4_ = auVar123._20_4_ + auVar123._20_4_;
    local_2e0._24_4_ = auVar123._24_4_ + auVar123._24_4_;
    local_2e0._28_4_ = auVar123._28_4_ + auVar123._28_4_;
    auVar6 = vsubps_avx(auVar127,auVar22);
    auVar258 = ZEXT1632(auVar7);
    auVar142 = ZEXT1632(CONCAT412(fVar263 * fVar263,
                                  CONCAT48(fVar262 * fVar262,
                                           CONCAT44(fVar261 * fVar261,fVar257 * fVar257))));
    local_a80 = vsubps_avx(local_220,auVar142);
    auVar23._4_4_ = local_2e0._4_4_ * local_2e0._4_4_;
    auVar23._0_4_ = local_2e0._0_4_ * local_2e0._0_4_;
    auVar23._8_4_ = local_2e0._8_4_ * local_2e0._8_4_;
    auVar23._12_4_ = local_2e0._12_4_ * local_2e0._12_4_;
    auVar23._16_4_ = local_2e0._16_4_ * local_2e0._16_4_;
    auVar23._20_4_ = local_2e0._20_4_ * local_2e0._20_4_;
    auVar23._24_4_ = local_2e0._24_4_ * local_2e0._24_4_;
    auVar23._28_4_ = auVar8._28_4_;
    fVar204 = local_a80._0_4_;
    fVar206 = local_a80._4_4_;
    fVar208 = local_a80._8_4_;
    fVar183 = local_a80._12_4_;
    fVar184 = local_a80._16_4_;
    fVar185 = local_a80._20_4_;
    fVar186 = local_a80._24_4_;
    auVar24._4_4_ = auVar6._4_4_ * fVar206 * 4.0;
    auVar24._0_4_ = auVar6._0_4_ * fVar204 * 4.0;
    auVar24._8_4_ = auVar6._8_4_ * fVar208 * 4.0;
    auVar24._12_4_ = auVar6._12_4_ * fVar183 * 4.0;
    auVar24._16_4_ = auVar6._16_4_ * fVar184 * 4.0;
    auVar24._20_4_ = auVar6._20_4_ * fVar185 * 4.0;
    auVar24._24_4_ = auVar6._24_4_ * fVar186 * 4.0;
    auVar24._28_4_ = 0x40800000;
    auVar145 = vsubps_avx(auVar23,auVar24);
    auVar240 = ZEXT3264(auVar145);
    auVar123 = vcmpps_avx(auVar145,auVar198,5);
    local_300._0_4_ = fVar204 + fVar204;
    local_300._4_4_ = fVar206 + fVar206;
    local_300._8_4_ = fVar208 + fVar208;
    local_300._12_4_ = fVar183 + fVar183;
    local_300._16_4_ = fVar184 + fVar184;
    local_300._20_4_ = fVar185 + fVar185;
    local_300._24_4_ = fVar186 + fVar186;
    local_300._28_4_ = local_a80._28_4_ + local_a80._28_4_;
    auVar285 = ZEXT1632(auVar88);
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0x7f,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar123 >> 0xbf,0) == '\0') &&
        (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar123[0x1f])
    {
      auVar199._8_4_ = 0x7f800000;
      auVar199._0_8_ = 0x7f8000007f800000;
      auVar199._12_4_ = 0x7f800000;
      auVar199._16_4_ = 0x7f800000;
      auVar199._20_4_ = 0x7f800000;
      auVar199._24_4_ = 0x7f800000;
      auVar199._28_4_ = 0x7f800000;
      auVar255 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar9 = vsqrtps_avx(auVar145);
      auVar198 = vcmpps_avx(auVar145,auVar198,5);
      auVar240 = ZEXT3264(auVar198);
      auVar145 = vrcpps_avx(local_300);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar124._16_4_ = 0x3f800000;
      auVar124._20_4_ = 0x3f800000;
      auVar124._24_4_ = 0x3f800000;
      auVar124._28_4_ = 0x3f800000;
      auVar7 = vfnmadd213ps_fma(auVar145,local_300,auVar124);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar145,auVar145);
      uVar74 = CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
      auVar200._0_8_ = uVar74 ^ 0x8000000080000000;
      auVar200._8_4_ = -local_2e0._8_4_;
      auVar200._12_4_ = -local_2e0._12_4_;
      auVar200._16_4_ = -local_2e0._16_4_;
      auVar200._20_4_ = -local_2e0._20_4_;
      auVar200._24_4_ = -local_2e0._24_4_;
      auVar200._28_4_ = -local_2e0._28_4_;
      auVar145 = vsubps_avx(auVar200,auVar9);
      auVar25._4_4_ = auVar7._4_4_ * auVar145._4_4_;
      auVar25._0_4_ = auVar7._0_4_ * auVar145._0_4_;
      auVar25._8_4_ = auVar7._8_4_ * auVar145._8_4_;
      auVar25._12_4_ = auVar7._12_4_ * auVar145._12_4_;
      auVar25._16_4_ = auVar145._16_4_ * 0.0;
      auVar25._20_4_ = auVar145._20_4_ * 0.0;
      auVar25._24_4_ = auVar145._24_4_ * 0.0;
      auVar25._28_4_ = auVar145._28_4_;
      auVar145 = vsubps_avx(auVar9,local_2e0);
      auVar278._0_4_ = auVar145._0_4_ * auVar7._0_4_;
      auVar278._4_4_ = auVar145._4_4_ * auVar7._4_4_;
      auVar278._8_4_ = auVar145._8_4_ * auVar7._8_4_;
      auVar278._12_4_ = auVar145._12_4_ * auVar7._12_4_;
      auVar278._16_4_ = auVar145._16_4_ * 0.0;
      auVar278._20_4_ = auVar145._20_4_ * 0.0;
      auVar278._24_4_ = auVar145._24_4_ * 0.0;
      auVar278._28_4_ = 0;
      auVar7 = vfmadd213ps_fma(auVar258,auVar25,auVar285);
      local_340 = auVar7._0_4_ * fVar187;
      fStack_33c = auVar7._4_4_ * fVar205;
      fStack_338 = auVar7._8_4_ * fVar207;
      fStack_334 = auVar7._12_4_ * fVar209;
      uStack_330 = 0;
      uStack_32c = 0;
      uStack_328 = 0;
      uStack_324 = 0x80000000;
      auVar145 = vandps_avx(auVar142,local_720);
      auVar145 = vmaxps_avx(local_520,auVar145);
      auVar26._4_4_ = auVar145._4_4_ * 1.9073486e-06;
      auVar26._0_4_ = auVar145._0_4_ * 1.9073486e-06;
      auVar26._8_4_ = auVar145._8_4_ * 1.9073486e-06;
      auVar26._12_4_ = auVar145._12_4_ * 1.9073486e-06;
      auVar26._16_4_ = auVar145._16_4_ * 1.9073486e-06;
      auVar26._20_4_ = auVar145._20_4_ * 1.9073486e-06;
      auVar26._24_4_ = auVar145._24_4_ * 1.9073486e-06;
      auVar26._28_4_ = auVar145._28_4_;
      auVar145 = vandps_avx(local_a80,local_720);
      auVar9 = vcmpps_avx(auVar145,auVar26,1);
      auVar7 = vfmadd213ps_fma(auVar258,auVar278,auVar285);
      auVar98._8_4_ = 0x7f800000;
      auVar98._0_8_ = 0x7f8000007f800000;
      auVar98._12_4_ = 0x7f800000;
      auVar98._16_4_ = 0x7f800000;
      auVar98._20_4_ = 0x7f800000;
      auVar98._24_4_ = 0x7f800000;
      auVar98._28_4_ = 0x7f800000;
      auVar199 = vblendvps_avx(auVar98,auVar25,auVar198);
      local_360 = fVar187 * auVar7._0_4_;
      fStack_35c = fVar205 * auVar7._4_4_;
      fStack_358 = fVar207 * auVar7._8_4_;
      fStack_354 = fVar209 * auVar7._12_4_;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x7f800000;
      auVar177._8_4_ = 0xff800000;
      auVar177._0_8_ = 0xff800000ff800000;
      auVar177._12_4_ = 0xff800000;
      auVar177._16_4_ = 0xff800000;
      auVar177._20_4_ = 0xff800000;
      auVar177._24_4_ = 0xff800000;
      auVar177._28_4_ = 0xff800000;
      auVar145 = vblendvps_avx(auVar177,auVar278,auVar198);
      auVar255 = ZEXT3264(auVar145);
      auVar11 = auVar198 & auVar9;
      local_740 = auVar142;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar123 = vandps_avx(auVar9,auVar198);
        auVar9 = vcmpps_avx(auVar6,_DAT_01f7b000,2);
        auVar151._8_4_ = 0xff800000;
        auVar151._0_8_ = 0xff800000ff800000;
        auVar151._12_4_ = 0xff800000;
        auVar151._16_4_ = 0xff800000;
        auVar151._20_4_ = 0xff800000;
        auVar151._24_4_ = 0xff800000;
        auVar151._28_4_ = 0xff800000;
        auVar110._8_4_ = 0x7f800000;
        auVar110._0_8_ = 0x7f8000007f800000;
        auVar110._12_4_ = 0x7f800000;
        auVar110._16_4_ = 0x7f800000;
        auVar110._20_4_ = 0x7f800000;
        auVar110._24_4_ = 0x7f800000;
        auVar110._28_4_ = 0x7f800000;
        auVar6 = vblendvps_avx(auVar110,auVar151,auVar9);
        auVar7 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar11 = vpmovsxwd_avx2(auVar7);
        auVar199 = vblendvps_avx(auVar199,auVar6,auVar11);
        auVar6 = vblendvps_avx(auVar151,auVar110,auVar9);
        auVar6 = vblendvps_avx(auVar145,auVar6,auVar11);
        auVar255 = ZEXT3264(auVar6);
        auVar182._0_8_ = auVar123._0_8_ ^ 0xffffffffffffffff;
        auVar182._8_4_ = auVar123._8_4_ ^ 0xffffffff;
        auVar182._12_4_ = auVar123._12_4_ ^ 0xffffffff;
        auVar182._16_4_ = auVar123._16_4_ ^ 0xffffffff;
        auVar182._20_4_ = auVar123._20_4_ ^ 0xffffffff;
        auVar182._24_4_ = auVar123._24_4_ ^ 0xffffffff;
        auVar182._28_4_ = auVar123._28_4_ ^ 0xffffffff;
        auVar123 = vorps_avx(auVar9,auVar182);
        auVar123 = vandps_avx(auVar198,auVar123);
      }
    }
    auVar279 = ZEXT3264(local_320);
    auVar6 = local_320 & auVar123;
    if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar6 >> 0x7f,0) == '\0') &&
          (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar6 >> 0xbf,0) == '\0') &&
        (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar6[0x1f]) {
LAB_01165f13:
      auVar266 = ZEXT3264(auVar176);
      auVar231 = ZEXT3264(auVar265);
    }
    else {
      fVar257 = (ray->org).field_0.m128[3] - (float)local_820._0_4_;
      auVar178._4_4_ = fVar257;
      auVar178._0_4_ = fVar257;
      auVar178._8_4_ = fVar257;
      auVar178._12_4_ = fVar257;
      auVar178._16_4_ = fVar257;
      auVar178._20_4_ = fVar257;
      auVar178._24_4_ = fVar257;
      auVar178._28_4_ = fVar257;
      auVar6 = vmaxps_avx(auVar178,auVar199);
      fVar257 = ray->tfar - (float)local_820._0_4_;
      auVar201._4_4_ = fVar257;
      auVar201._0_4_ = fVar257;
      auVar201._8_4_ = fVar257;
      auVar201._12_4_ = fVar257;
      auVar201._16_4_ = fVar257;
      auVar201._20_4_ = fVar257;
      auVar201._24_4_ = fVar257;
      auVar201._28_4_ = fVar257;
      auVar145 = vminps_avx(auVar201,auVar255._0_32_);
      auVar27._4_4_ = fVar223 * fVar210;
      auVar27._0_4_ = fVar167 * fVar111;
      auVar27._8_4_ = fVar233 * fVar218;
      auVar27._12_4_ = fVar241 * fVar219;
      auVar27._16_4_ = fVar242 * fVar220;
      auVar27._20_4_ = fVar243 * fVar221;
      auVar27._24_4_ = fVar166 * fVar222;
      auVar27._28_4_ = auVar104._28_4_;
      auVar7 = vfmadd213ps_fma(auVar265,local_9e0,auVar27);
      auVar88 = vfmadd213ps_fma(auVar176,local_900,ZEXT1632(auVar7));
      auVar28._4_4_ = fVar210 * fStack_6dc;
      auVar28._0_4_ = fVar111 * local_6e0;
      auVar28._8_4_ = fVar218 * fStack_6d8;
      auVar28._12_4_ = fVar219 * fStack_6d4;
      auVar28._16_4_ = fVar220 * fStack_6d0;
      auVar28._20_4_ = fVar221 * fStack_6cc;
      auVar28._24_4_ = fVar222 * fStack_6c8;
      auVar28._28_4_ = auVar104._28_4_;
      auVar7 = vfmadd231ps_fma(auVar28,_local_5e0,local_9e0);
      auVar271 = vfmadd231ps_fma(ZEXT1632(auVar7),local_900,_local_6c0);
      auVar255 = ZEXT3264(local_720);
      auVar176 = vandps_avx(local_720,ZEXT1632(auVar271));
      auVar99._8_4_ = 0x219392ef;
      auVar99._0_8_ = 0x219392ef219392ef;
      auVar99._12_4_ = 0x219392ef;
      auVar99._16_4_ = 0x219392ef;
      auVar99._20_4_ = 0x219392ef;
      auVar99._24_4_ = 0x219392ef;
      auVar99._28_4_ = 0x219392ef;
      auVar265 = vcmpps_avx(auVar176,auVar99,1);
      auVar176 = vrcpps_avx(ZEXT1632(auVar271));
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar100._16_4_ = 0x3f800000;
      auVar100._20_4_ = 0x3f800000;
      auVar100._24_4_ = 0x3f800000;
      auVar100._28_4_ = 0x3f800000;
      auVar104 = ZEXT1632(auVar271);
      auVar7 = vfnmadd213ps_fma(auVar176,auVar104,auVar100);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar176,auVar176);
      auVar274._0_8_ = auVar271._0_8_ ^ 0x8000000080000000;
      auVar274._8_4_ = auVar271._8_4_ ^ 0x80000000;
      auVar274._12_4_ = auVar271._12_4_ ^ 0x80000000;
      auVar274._16_4_ = 0x80000000;
      auVar274._20_4_ = 0x80000000;
      auVar274._24_4_ = 0x80000000;
      auVar274._28_4_ = 0x80000000;
      auVar29._4_4_ = auVar7._4_4_ * -auVar88._4_4_;
      auVar29._0_4_ = auVar7._0_4_ * -auVar88._0_4_;
      auVar29._8_4_ = auVar7._8_4_ * -auVar88._8_4_;
      auVar29._12_4_ = auVar7._12_4_ * -auVar88._12_4_;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar176 = vcmpps_avx(auVar104,auVar274,1);
      auVar176 = vorps_avx(auVar265,auVar176);
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
      auVar176 = vblendvps_avx(auVar29,auVar264,auVar176);
      auVar6 = vmaxps_avx(auVar6,auVar176);
      auVar176 = vcmpps_avx(auVar104,auVar274,6);
      auVar176 = vorps_avx(auVar265,auVar176);
      auVar275._8_4_ = 0x7f800000;
      auVar275._0_8_ = 0x7f8000007f800000;
      auVar275._12_4_ = 0x7f800000;
      auVar275._16_4_ = 0x7f800000;
      auVar275._20_4_ = 0x7f800000;
      auVar275._24_4_ = 0x7f800000;
      auVar275._28_4_ = 0x7f800000;
      auVar176 = vblendvps_avx(auVar29,auVar275,auVar176);
      auVar145 = vminps_avx(auVar145,auVar176);
      fVar167 = -local_a20._0_4_;
      fVar111 = -local_a20._4_4_;
      fVar210 = -local_a20._8_4_;
      fVar218 = -local_a20._12_4_;
      fVar219 = -local_a20._16_4_;
      fVar220 = -local_a20._20_4_;
      fVar221 = -local_a20._24_4_;
      auVar229._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
      auVar229._8_4_ = -local_a40._8_4_;
      auVar229._12_4_ = -local_a40._12_4_;
      auVar229._16_4_ = -local_a40._16_4_;
      auVar229._20_4_ = -local_a40._20_4_;
      auVar229._24_4_ = -local_a40._24_4_;
      auVar229._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar265 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar176 = vsubps_avx(auVar265,local_760);
      auVar265 = vsubps_avx(auVar265,local_9c0);
      auVar30._4_4_ = auVar265._4_4_ * fVar111;
      auVar30._0_4_ = auVar265._0_4_ * fVar167;
      auVar30._8_4_ = auVar265._8_4_ * fVar210;
      auVar30._12_4_ = auVar265._12_4_ * fVar218;
      auVar30._16_4_ = auVar265._16_4_ * fVar219;
      auVar30._20_4_ = auVar265._20_4_ * fVar220;
      auVar30._24_4_ = auVar265._24_4_ * fVar221;
      auVar30._28_4_ = auVar265._28_4_;
      auVar7 = vfmadd231ps_fma(auVar30,auVar229,auVar176);
      local_a00._28_4_ = auVar179._28_4_;
      auVar236._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
      auVar236._8_4_ = -auVar179._8_4_;
      auVar236._12_4_ = -auVar179._12_4_;
      auVar236._16_4_ = -auVar179._16_4_;
      auVar236._20_4_ = -auVar179._20_4_;
      auVar236._24_4_ = -auVar179._24_4_;
      auVar236._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar176 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,_local_860);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar236,auVar176);
      auVar31._4_4_ = fVar111 * fStack_6dc;
      auVar31._0_4_ = fVar167 * local_6e0;
      auVar31._8_4_ = fVar210 * fStack_6d8;
      auVar31._12_4_ = fVar218 * fStack_6d4;
      auVar31._16_4_ = fVar219 * fStack_6d0;
      auVar31._20_4_ = fVar220 * fStack_6cc;
      auVar31._24_4_ = fVar221 * fStack_6c8;
      auVar31._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar7 = vfmadd231ps_fma(auVar31,_local_5e0,auVar229);
      auVar271 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar236,_local_6c0);
      auVar176 = vandps_avx(local_720,ZEXT1632(auVar271));
      auVar104 = vrcpps_avx(ZEXT1632(auVar271));
      auVar215._8_4_ = 0x219392ef;
      auVar215._0_8_ = 0x219392ef219392ef;
      auVar215._12_4_ = 0x219392ef;
      auVar215._16_4_ = 0x219392ef;
      auVar215._20_4_ = 0x219392ef;
      auVar215._24_4_ = 0x219392ef;
      auVar215._28_4_ = 0x219392ef;
      auVar217 = ZEXT3264(auVar215);
      auVar265 = vcmpps_avx(auVar176,auVar215,1);
      auVar179 = ZEXT1632(auVar271);
      auVar7 = vfnmadd213ps_fma(auVar104,auVar179,auVar100);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar104,auVar104);
      auVar237._0_8_ = auVar271._0_8_ ^ 0x8000000080000000;
      auVar237._8_4_ = auVar271._8_4_ ^ 0x80000000;
      auVar237._12_4_ = auVar271._12_4_ ^ 0x80000000;
      auVar237._16_4_ = 0x80000000;
      auVar237._20_4_ = 0x80000000;
      auVar237._24_4_ = 0x80000000;
      auVar237._28_4_ = 0x80000000;
      auVar240 = ZEXT3264(auVar237);
      auVar32._4_4_ = auVar7._4_4_ * -auVar88._4_4_;
      auVar32._0_4_ = auVar7._0_4_ * -auVar88._0_4_;
      auVar32._8_4_ = auVar7._8_4_ * -auVar88._8_4_;
      auVar32._12_4_ = auVar7._12_4_ * -auVar88._12_4_;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar176 = vcmpps_avx(auVar179,auVar237,1);
      auVar176 = vorps_avx(auVar176,auVar265);
      auVar101._8_4_ = 0xff800000;
      auVar101._0_8_ = 0xff800000ff800000;
      auVar101._12_4_ = 0xff800000;
      auVar101._16_4_ = 0xff800000;
      auVar101._20_4_ = 0xff800000;
      auVar101._24_4_ = 0xff800000;
      auVar101._28_4_ = 0xff800000;
      auVar176 = vblendvps_avx(auVar32,auVar101,auVar176);
      _local_700 = vmaxps_avx(auVar6,auVar176);
      auVar6 = vcmpps_avx(auVar179,auVar237,6);
      auVar6 = vorps_avx(auVar265,auVar6);
      auVar104 = vblendvps_avx(auVar32,auVar275,auVar6);
      auVar6 = vandps_avx(local_320,auVar123);
      local_580 = vminps_avx(auVar145,auVar104);
      auVar104 = vcmpps_avx(_local_700,local_580,2);
      auVar145 = auVar6 & auVar104;
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar145 >> 0x7f,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar145 >> 0xbf,0) == '\0') &&
          (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar145[0x1f]) goto LAB_01165f13;
      auVar63._4_4_ = fStack_33c;
      auVar63._0_4_ = local_340;
      auVar63._8_4_ = fStack_338;
      auVar63._12_4_ = fStack_334;
      auVar63._16_4_ = uStack_330;
      auVar63._20_4_ = uStack_32c;
      auVar63._24_4_ = uStack_328;
      auVar63._28_4_ = uStack_324;
      auVar216._8_4_ = 0x3f800000;
      auVar216._0_8_ = 0x3f8000003f800000;
      auVar216._12_4_ = 0x3f800000;
      auVar216._16_4_ = 0x3f800000;
      auVar216._20_4_ = 0x3f800000;
      auVar216._24_4_ = 0x3f800000;
      auVar216._28_4_ = 0x3f800000;
      auVar176 = vminps_avx(auVar63,auVar216);
      auVar266 = ZEXT864(0) << 0x20;
      auVar176 = vmaxps_avx(auVar176,ZEXT832(0) << 0x20);
      auVar62._4_4_ = fStack_35c;
      auVar62._0_4_ = local_360;
      auVar62._8_4_ = fStack_358;
      auVar62._12_4_ = fStack_354;
      auVar62._16_4_ = uStack_350;
      auVar62._20_4_ = uStack_34c;
      auVar62._24_4_ = uStack_348;
      auVar62._28_4_ = uStack_344;
      auVar265 = vminps_avx(auVar62,auVar216);
      auVar265 = vmaxps_avx(auVar265,ZEXT832(0) << 0x20);
      auVar33._4_4_ = (auVar176._4_4_ + 1.0) * 0.125;
      auVar33._0_4_ = (auVar176._0_4_ + 0.0) * 0.125;
      auVar33._8_4_ = (auVar176._8_4_ + 2.0) * 0.125;
      auVar33._12_4_ = (auVar176._12_4_ + 3.0) * 0.125;
      auVar33._16_4_ = (auVar176._16_4_ + 4.0) * 0.125;
      auVar33._20_4_ = (auVar176._20_4_ + 5.0) * 0.125;
      auVar33._24_4_ = (auVar176._24_4_ + 6.0) * 0.125;
      auVar33._28_4_ = auVar176._28_4_ + 7.0;
      auVar7 = vfmadd213ps_fma(auVar33,local_840,local_880);
      auVar34._4_4_ = (auVar265._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar265._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar265._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar265._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar265._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar265._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar265._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar265._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar34,local_840,local_880);
      auVar176 = vminps_avx(auVar213,local_7a0);
      auVar265 = vminps_avx(local_7c0,auVar12);
      auVar176 = vminps_avx(auVar176,auVar265);
      auVar265 = vsubps_avx(auVar176,auVar8);
      auVar176 = vandps_avx(auVar104,auVar6);
      local_1a0 = ZEXT1632(auVar7);
      local_1c0 = ZEXT1632(auVar88);
      auVar35._4_4_ = auVar265._4_4_ * 0.99999976;
      auVar35._0_4_ = auVar265._0_4_ * 0.99999976;
      auVar35._8_4_ = auVar265._8_4_ * 0.99999976;
      auVar35._12_4_ = auVar265._12_4_ * 0.99999976;
      auVar35._16_4_ = auVar265._16_4_ * 0.99999976;
      auVar35._20_4_ = auVar265._20_4_ * 0.99999976;
      auVar35._24_4_ = auVar265._24_4_ * 0.99999976;
      auVar35._28_4_ = 0x3f7ffffc;
      auVar265 = vmaxps_avx(ZEXT832(0) << 0x20,auVar35);
      auVar36._4_4_ = auVar265._4_4_ * auVar265._4_4_;
      auVar36._0_4_ = auVar265._0_4_ * auVar265._0_4_;
      auVar36._8_4_ = auVar265._8_4_ * auVar265._8_4_;
      auVar36._12_4_ = auVar265._12_4_ * auVar265._12_4_;
      auVar36._16_4_ = auVar265._16_4_ * auVar265._16_4_;
      auVar36._20_4_ = auVar265._20_4_ * auVar265._20_4_;
      auVar36._24_4_ = auVar265._24_4_ * auVar265._24_4_;
      auVar36._28_4_ = auVar265._28_4_;
      auVar6 = vsubps_avx(auVar127,auVar36);
      auVar37._4_4_ = auVar6._4_4_ * fVar206 * 4.0;
      auVar37._0_4_ = auVar6._0_4_ * fVar204 * 4.0;
      auVar37._8_4_ = auVar6._8_4_ * fVar208 * 4.0;
      auVar37._12_4_ = auVar6._12_4_ * fVar183 * 4.0;
      auVar37._16_4_ = auVar6._16_4_ * fVar184 * 4.0;
      auVar37._20_4_ = auVar6._20_4_ * fVar185 * 4.0;
      auVar37._24_4_ = auVar6._24_4_ * fVar186 * 4.0;
      auVar37._28_4_ = auVar265._28_4_;
      auVar8 = vsubps_avx(auVar23,auVar37);
      local_9a0 = vcmpps_avx(auVar8,ZEXT832(0) << 0x20,5);
      auVar265 = local_9a0;
      if ((((((((local_9a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9a0 >> 0x7f,0) == '\0') &&
            (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9a0 >> 0xbf,0) == '\0') &&
          (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9a0[0x1f]) {
        auVar145 = ZEXT1632(ZEXT816(0) << 0x40);
        auVar240 = ZEXT864(0) << 0x20;
        auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar127 = ZEXT1632(ZEXT816(0) << 0x40);
        _local_b00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar247._8_4_ = 0x7f800000;
        auVar247._0_8_ = 0x7f8000007f800000;
        auVar247._12_4_ = 0x7f800000;
        auVar247._16_4_ = 0x7f800000;
        auVar247._20_4_ = 0x7f800000;
        auVar247._24_4_ = 0x7f800000;
        auVar247._28_4_ = 0x7f800000;
        auVar253._8_4_ = 0xff800000;
        auVar253._0_8_ = 0xff800000ff800000;
        auVar253._12_4_ = 0xff800000;
        auVar253._16_4_ = 0xff800000;
        auVar253._20_4_ = 0xff800000;
        auVar253._24_4_ = 0xff800000;
        auVar253._28_4_ = 0xff800000;
        local_9a0 = auVar123;
      }
      else {
        auVar123 = vrcpps_avx(local_300);
        auVar105._8_4_ = 0x3f800000;
        auVar105._0_8_ = 0x3f8000003f800000;
        auVar105._12_4_ = 0x3f800000;
        auVar105._16_4_ = 0x3f800000;
        auVar105._20_4_ = 0x3f800000;
        auVar105._24_4_ = 0x3f800000;
        auVar105._28_4_ = 0x3f800000;
        auVar7 = vfnmadd213ps_fma(local_300,auVar123,auVar105);
        auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar123,auVar123);
        auVar123 = vsqrtps_avx(auVar8);
        uVar74 = CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
        auVar238._0_8_ = uVar74 ^ 0x8000000080000000;
        auVar238._8_4_ = -local_2e0._8_4_;
        auVar238._12_4_ = -local_2e0._12_4_;
        auVar238._16_4_ = -local_2e0._16_4_;
        auVar238._20_4_ = -local_2e0._20_4_;
        auVar238._24_4_ = -local_2e0._24_4_;
        auVar238._28_4_ = -local_2e0._28_4_;
        auVar104 = vsubps_avx(auVar238,auVar123);
        auVar127 = vsubps_avx(auVar123,local_2e0);
        fVar204 = auVar104._0_4_ * auVar7._0_4_;
        fVar206 = auVar104._4_4_ * auVar7._4_4_;
        auVar38._4_4_ = fVar206;
        auVar38._0_4_ = fVar204;
        fVar208 = auVar104._8_4_ * auVar7._8_4_;
        auVar38._8_4_ = fVar208;
        fVar183 = auVar104._12_4_ * auVar7._12_4_;
        auVar38._12_4_ = fVar183;
        fVar184 = auVar104._16_4_ * 0.0;
        auVar38._16_4_ = fVar184;
        fVar185 = auVar104._20_4_ * 0.0;
        auVar38._20_4_ = fVar185;
        fVar186 = auVar104._24_4_ * 0.0;
        auVar38._24_4_ = fVar186;
        auVar38._28_4_ = auVar123._28_4_;
        auVar202._0_4_ = auVar127._0_4_ * auVar7._0_4_;
        auVar202._4_4_ = auVar127._4_4_ * auVar7._4_4_;
        auVar202._8_4_ = auVar127._8_4_ * auVar7._8_4_;
        auVar202._12_4_ = auVar127._12_4_ * auVar7._12_4_;
        auVar202._16_4_ = auVar127._16_4_ * 0.0;
        auVar202._20_4_ = auVar127._20_4_ * 0.0;
        auVar202._24_4_ = auVar127._24_4_ * 0.0;
        auVar202._28_4_ = 0;
        auVar7 = vfmadd213ps_fma(auVar258,auVar38,auVar285);
        auVar88 = vfmadd213ps_fma(auVar258,auVar202,auVar285);
        auVar123 = ZEXT1632(CONCAT412(auVar7._12_4_ * fVar209,
                                      CONCAT48(auVar7._8_4_ * fVar207,
                                               CONCAT44(auVar7._4_4_ * fVar205,
                                                        auVar7._0_4_ * fVar187))));
        auVar39._28_4_ = auVar127._28_4_;
        auVar39._0_28_ =
             ZEXT1628(CONCAT412(auVar88._12_4_ * fVar209,
                                CONCAT48(auVar88._8_4_ * fVar207,
                                         CONCAT44(auVar88._4_4_ * fVar205,auVar88._0_4_ * fVar187)))
                     );
        auVar7 = vfmadd213ps_fma(local_2a0,auVar123,local_a60);
        auVar88 = vfmadd213ps_fma(local_2a0,auVar39,local_a60);
        auVar271 = vfmadd213ps_fma(local_2c0,auVar123,local_260);
        auVar250 = vfmadd213ps_fma(local_2c0,auVar39,local_260);
        auVar272 = vfmadd213ps_fma(auVar123,local_280,auVar273);
        auVar84 = vfmadd213ps_fma(local_280,auVar39,auVar273);
        auVar40._4_4_ = (float)local_6c0._4_4_ * fVar206;
        auVar40._0_4_ = (float)local_6c0._0_4_ * fVar204;
        auVar40._8_4_ = fStack_6b8 * fVar208;
        auVar40._12_4_ = fStack_6b4 * fVar183;
        auVar40._16_4_ = fStack_6b0 * fVar184;
        auVar40._20_4_ = fStack_6ac * fVar185;
        auVar40._24_4_ = fStack_6a8 * fVar186;
        auVar40._28_4_ = 0;
        auVar104 = vsubps_avx(auVar40,ZEXT1632(auVar7));
        auVar67._4_4_ = (float)local_5e0._4_4_ * fVar206;
        auVar67._0_4_ = (float)local_5e0._0_4_ * fVar204;
        auVar67._8_4_ = fStack_5d8 * fVar208;
        auVar67._12_4_ = fStack_5d4 * fVar183;
        auVar67._16_4_ = fStack_5d0 * fVar184;
        auVar67._20_4_ = fStack_5cc * fVar185;
        auVar67._24_4_ = fStack_5c8 * fVar186;
        auVar67._28_4_ = 0x80000000;
        auVar127 = vsubps_avx(auVar67,ZEXT1632(auVar271));
        auVar144._0_4_ = local_6e0 * fVar204;
        auVar144._4_4_ = fStack_6dc * fVar206;
        auVar144._8_4_ = fStack_6d8 * fVar208;
        auVar144._12_4_ = fStack_6d4 * fVar183;
        auVar144._16_4_ = fStack_6d0 * fVar184;
        auVar144._20_4_ = fStack_6cc * fVar185;
        auVar144._24_4_ = fStack_6c8 * fVar186;
        auVar144._28_4_ = 0;
        auVar123 = vsubps_avx(auVar144,ZEXT1632(auVar272));
        _local_b00 = auVar123._0_28_;
        auVar41._4_4_ = (float)local_6c0._4_4_ * auVar202._4_4_;
        auVar41._0_4_ = (float)local_6c0._0_4_ * auVar202._0_4_;
        auVar41._8_4_ = fStack_6b8 * auVar202._8_4_;
        auVar41._12_4_ = fStack_6b4 * auVar202._12_4_;
        auVar41._16_4_ = fStack_6b0 * auVar202._16_4_;
        auVar41._20_4_ = fStack_6ac * auVar202._20_4_;
        auVar41._24_4_ = fStack_6a8 * auVar202._24_4_;
        auVar41._28_4_ = auVar123._28_4_;
        auVar145 = vsubps_avx(auVar41,ZEXT1632(auVar88));
        auVar266 = ZEXT3264(auVar145);
        auVar42._4_4_ = (float)local_5e0._4_4_ * auVar202._4_4_;
        auVar42._0_4_ = (float)local_5e0._0_4_ * auVar202._0_4_;
        auVar42._8_4_ = fStack_5d8 * auVar202._8_4_;
        auVar42._12_4_ = fStack_5d4 * auVar202._12_4_;
        auVar42._16_4_ = fStack_5d0 * auVar202._16_4_;
        auVar42._20_4_ = fStack_5cc * auVar202._20_4_;
        auVar42._24_4_ = fStack_5c8 * auVar202._24_4_;
        auVar42._28_4_ = auVar123._28_4_;
        auVar145 = vsubps_avx(auVar42,ZEXT1632(auVar250));
        auVar239._0_4_ = local_6e0 * auVar202._0_4_;
        auVar239._4_4_ = fStack_6dc * auVar202._4_4_;
        auVar239._8_4_ = fStack_6d8 * auVar202._8_4_;
        auVar239._12_4_ = fStack_6d4 * auVar202._12_4_;
        auVar239._16_4_ = fStack_6d0 * auVar202._16_4_;
        auVar239._20_4_ = fStack_6cc * auVar202._20_4_;
        auVar239._24_4_ = fStack_6c8 * auVar202._24_4_;
        auVar239._28_4_ = 0;
        auVar123 = vsubps_avx(auVar239,ZEXT1632(auVar84));
        auVar240 = ZEXT3264(auVar123);
        auVar8 = vcmpps_avx(auVar8,_DAT_01f7b000,5);
        auVar248._8_4_ = 0x7f800000;
        auVar248._0_8_ = 0x7f8000007f800000;
        auVar248._12_4_ = 0x7f800000;
        auVar248._16_4_ = 0x7f800000;
        auVar248._20_4_ = 0x7f800000;
        auVar248._24_4_ = 0x7f800000;
        auVar248._28_4_ = 0x7f800000;
        auVar247 = vblendvps_avx(auVar248,auVar38,auVar8);
        auVar123 = vandps_avx(local_720,auVar142);
        auVar123 = vmaxps_avx(local_520,auVar123);
        auVar43._4_4_ = auVar123._4_4_ * 1.9073486e-06;
        auVar43._0_4_ = auVar123._0_4_ * 1.9073486e-06;
        auVar43._8_4_ = auVar123._8_4_ * 1.9073486e-06;
        auVar43._12_4_ = auVar123._12_4_ * 1.9073486e-06;
        auVar43._16_4_ = auVar123._16_4_ * 1.9073486e-06;
        auVar43._20_4_ = auVar123._20_4_ * 1.9073486e-06;
        auVar43._24_4_ = auVar123._24_4_ * 1.9073486e-06;
        auVar43._28_4_ = auVar123._28_4_;
        auVar123 = vandps_avx(local_720,local_a80);
        auVar123 = vcmpps_avx(auVar123,auVar43,1);
        auVar254._8_4_ = 0xff800000;
        auVar254._0_8_ = 0xff800000ff800000;
        auVar254._12_4_ = 0xff800000;
        auVar254._16_4_ = 0xff800000;
        auVar254._20_4_ = 0xff800000;
        auVar254._24_4_ = 0xff800000;
        auVar254._28_4_ = 0xff800000;
        auVar253 = vblendvps_avx(auVar254,auVar202,auVar8);
        auVar179 = auVar8 & auVar123;
        local_740 = auVar142;
        if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0x7f,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar179 >> 0xbf,0) != '\0') ||
            (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar179[0x1f] < '\0') {
          auVar123 = vandps_avx(auVar8,auVar123);
          auVar6 = vcmpps_avx(auVar6,ZEXT832(0) << 0x20,2);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar265 = vblendvps_avx(auVar286,auVar260,auVar6);
          auVar7 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
          auVar179 = vpmovsxwd_avx2(auVar7);
          auVar247 = vblendvps_avx(auVar247,auVar265,auVar179);
          auVar265 = vblendvps_avx(auVar260,auVar286,auVar6);
          auVar253 = vblendvps_avx(auVar253,auVar265,auVar179);
          auVar203._0_8_ = auVar123._0_8_ ^ 0xffffffffffffffff;
          auVar203._8_4_ = auVar123._8_4_ ^ 0xffffffff;
          auVar203._12_4_ = auVar123._12_4_ ^ 0xffffffff;
          auVar203._16_4_ = auVar123._16_4_ ^ 0xffffffff;
          auVar203._20_4_ = auVar123._20_4_ ^ 0xffffffff;
          auVar203._24_4_ = auVar123._24_4_ ^ 0xffffffff;
          auVar203._28_4_ = auVar123._28_4_ ^ 0xffffffff;
          auVar123 = vorps_avx(auVar6,auVar203);
          auVar265 = vandps_avx(auVar8,auVar123);
        }
      }
      uVar77 = *(undefined4 *)&(ray->dir).field_0;
      auVar259._4_4_ = uVar77;
      auVar259._0_4_ = uVar77;
      auVar259._8_4_ = uVar77;
      auVar259._12_4_ = uVar77;
      auVar259._16_4_ = uVar77;
      auVar259._20_4_ = uVar77;
      auVar259._24_4_ = uVar77;
      auVar259._28_4_ = uVar77;
      uVar77 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar230._4_4_ = uVar77;
      auVar230._0_4_ = uVar77;
      auVar230._8_4_ = uVar77;
      auVar230._12_4_ = uVar77;
      auVar230._16_4_ = uVar77;
      auVar230._20_4_ = uVar77;
      auVar230._24_4_ = uVar77;
      auVar230._28_4_ = uVar77;
      auVar231 = ZEXT3264(auVar230);
      fVar187 = (ray->dir).field_0.m128[2];
      auVar279 = ZEXT3264(_local_700);
      local_560 = _local_700;
      local_540 = vminps_avx(local_580,auVar247);
      local_7e0 = vmaxps_avx(_local_700,auVar253);
      auVar255 = ZEXT3264(local_7e0);
      _local_5a0 = local_7e0;
      auVar123 = vcmpps_avx(_local_700,local_540,2);
      local_600 = vandps_avx(auVar123,auVar176);
      auVar123 = vcmpps_avx(local_7e0,local_580,2);
      local_a00 = vandps_avx(auVar123,auVar176);
      auVar217 = ZEXT3264(local_a00);
      auVar123 = vorps_avx(local_600,local_a00);
      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar123 >> 0x7f,0) != '\0') ||
            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar123 >> 0xbf,0) != '\0') ||
          (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar123[0x1f] < '\0') {
        auVar44._4_4_ = auVar240._4_4_ * fVar187;
        auVar44._0_4_ = auVar240._0_4_ * fVar187;
        auVar44._8_4_ = auVar240._8_4_ * fVar187;
        auVar44._12_4_ = auVar240._12_4_ * fVar187;
        auVar44._16_4_ = auVar240._16_4_ * fVar187;
        auVar44._20_4_ = auVar240._20_4_ * fVar187;
        auVar44._24_4_ = auVar240._24_4_ * fVar187;
        auVar44._28_4_ = auVar123._28_4_;
        auVar7 = vfmadd213ps_fma(auVar145,auVar230,auVar44);
        auVar45._4_4_ = fVar187 * (float)local_b00._4_4_;
        auVar45._0_4_ = fVar187 * (float)local_b00._0_4_;
        auVar45._8_4_ = fVar187 * fStack_af8;
        auVar45._12_4_ = fVar187 * fStack_af4;
        auVar45._16_4_ = fVar187 * fStack_af0;
        auVar45._20_4_ = fVar187 * fStack_aec;
        auVar45._24_4_ = fVar187 * fStack_ae8;
        auVar45._28_4_ = auVar123._28_4_;
        auVar88 = vfmadd213ps_fma(auVar127,auVar230,auVar45);
        auVar7 = vfmadd213ps_fma(auVar266._0_32_,auVar259,ZEXT1632(auVar7));
        auVar266 = ZEXT1664(auVar7);
        auVar146._0_8_ = auVar265._0_8_ ^ 0xffffffffffffffff;
        auVar146._8_4_ = auVar265._8_4_ ^ 0xffffffff;
        auVar146._12_4_ = auVar265._12_4_ ^ 0xffffffff;
        auVar146._16_4_ = auVar265._16_4_ ^ 0xffffffff;
        auVar146._20_4_ = auVar265._20_4_ ^ 0xffffffff;
        auVar146._24_4_ = auVar265._24_4_ ^ 0xffffffff;
        auVar146._28_4_ = auVar265._28_4_ ^ 0xffffffff;
        auVar123 = vandps_avx(ZEXT1632(auVar7),local_720);
        auVar180._8_4_ = 0x3e99999a;
        auVar180._0_8_ = 0x3e99999a3e99999a;
        auVar180._12_4_ = 0x3e99999a;
        auVar180._16_4_ = 0x3e99999a;
        auVar180._20_4_ = 0x3e99999a;
        auVar180._24_4_ = 0x3e99999a;
        auVar180._28_4_ = 0x3e99999a;
        auVar123 = vcmpps_avx(auVar123,auVar180,1);
        local_640 = vorps_avx(auVar123,auVar146);
        auVar7 = vfmadd213ps_fma(auVar104,auVar259,ZEXT1632(auVar88));
        auVar123 = vandps_avx(ZEXT1632(auVar7),local_720);
        auVar123 = vcmpps_avx(auVar123,auVar180,1);
        auVar123 = vorps_avx(auVar123,auVar146);
        auVar128._8_4_ = 3;
        auVar128._0_8_ = 0x300000003;
        auVar128._12_4_ = 3;
        auVar128._16_4_ = 3;
        auVar128._20_4_ = 3;
        auVar128._24_4_ = 3;
        auVar128._28_4_ = 3;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar123 = vblendvps_avx(auVar147,auVar128,auVar123);
        local_660._4_4_ = local_b04;
        local_660._0_4_ = local_b04;
        local_660._8_4_ = local_b04;
        local_660._12_4_ = local_b04;
        local_660._16_4_ = local_b04;
        local_660._20_4_ = local_b04;
        local_660._24_4_ = local_b04;
        local_660._28_4_ = local_b04;
        local_620 = vpcmpgtd_avx2(auVar123,local_660);
        auVar123 = vpandn_avx2(local_620,local_600);
        local_800._4_4_ = local_700._4_4_ + (float)local_6a0._4_4_;
        local_800._0_4_ = local_700._0_4_ + (float)local_6a0._0_4_;
        fStack_7f8 = local_700._8_4_ + fStack_698;
        fStack_7f4 = local_700._12_4_ + fStack_694;
        fStack_7f0 = local_700._16_4_ + fStack_690;
        fStack_7ec = local_700._20_4_ + fStack_68c;
        fStack_7e8 = local_700._24_4_ + fStack_688;
        fStack_7e4 = local_700._28_4_ + fStack_684;
        while( true ) {
          local_380 = auVar123;
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar123 >> 0x7f,0) == '\0') &&
                (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0xbf,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar123[0x1f]) break;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar176 = vblendvps_avx(auVar129,_local_700,auVar123);
          auVar265 = vshufps_avx(auVar176,auVar176,0xb1);
          auVar265 = vminps_avx(auVar176,auVar265);
          auVar6 = vshufpd_avx(auVar265,auVar265,5);
          auVar265 = vminps_avx(auVar265,auVar6);
          auVar6 = vpermpd_avx2(auVar265,0x4e);
          auVar265 = vminps_avx(auVar265,auVar6);
          auVar176 = vcmpps_avx(auVar176,auVar265,0);
          auVar265 = auVar123 & auVar176;
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar265 >> 0x7f,0) != '\0') ||
                (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar265 >> 0xbf,0) != '\0') ||
              (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar265[0x1f] < '\0') {
            auVar123 = vandps_avx(auVar176,auVar123);
          }
          uVar70 = vmovmskps_avx(auVar123);
          iVar13 = 0;
          for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            iVar13 = iVar13 + 1;
          }
          uVar74 = (ulong)(uint)(iVar13 << 2);
          *(undefined4 *)(local_380 + uVar74) = 0;
          aVar1 = (ray->dir).field_0;
          local_8a0._0_16_ = (undefined1  [16])aVar1;
          auVar7 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          uVar70 = *(uint *)(local_1a0 + uVar74);
          auVar240 = ZEXT464(*(uint *)(local_560 + uVar74));
          if (auVar7._0_4_ < 0.0) {
            local_a60._0_16_ = ZEXT416(*(uint *)(local_560 + uVar74));
            auVar266 = ZEXT1664(auVar266._0_16_);
            auVar279 = ZEXT1664(auVar279._0_16_);
            fVar187 = sqrtf(auVar7._0_4_);
            auVar240 = ZEXT1664(local_a60._0_16_);
            auVar217 = ZEXT3264(local_a00);
            uVar74 = extraout_RAX;
          }
          else {
            auVar7 = vsqrtss_avx(auVar7,auVar7);
            fVar187 = auVar7._0_4_;
          }
          auVar231 = ZEXT464(uVar70);
          auVar88 = vminps_avx(local_940,local_960);
          auVar7 = vmaxps_avx(local_940,local_960);
          auVar271 = vminps_avx(local_950,_local_970);
          auVar250 = vminps_avx(auVar88,auVar271);
          auVar88 = vmaxps_avx(local_950,_local_970);
          auVar271 = vmaxps_avx(auVar7,auVar88);
          auVar7 = vandps_avx(auVar250,local_980);
          auVar88 = vandps_avx(auVar271,local_980);
          auVar7 = vmaxps_avx(auVar7,auVar88);
          auVar88 = vmovshdup_avx(auVar7);
          auVar88 = vmaxss_avx(auVar88,auVar7);
          auVar7 = vshufpd_avx(auVar7,auVar7,1);
          auVar7 = vmaxss_avx(auVar7,auVar88);
          local_9a0._0_4_ = auVar7._0_4_ * 1.9073486e-06;
          local_780._0_4_ = fVar187 * 1.9073486e-06;
          local_7c0._0_16_ = vshufps_avx(auVar271,auVar271,0xff);
          auVar7 = vinsertps_avx(auVar240._0_16_,ZEXT416(uVar70),0x10);
          uVar76 = 0;
          while( true ) {
            bVar69 = (byte)uVar74;
            if (uVar76 == 5) break;
            fVar209 = auVar7._0_4_;
            auVar87._4_4_ = fVar209;
            auVar87._0_4_ = fVar209;
            auVar87._8_4_ = fVar209;
            auVar87._12_4_ = fVar209;
            auVar271 = vfmadd213ps_fma(auVar87,local_8a0._0_16_,_DAT_01f45a50);
            local_9c0._0_16_ = vmovshdup_avx(auVar7);
            fVar207 = local_9c0._0_4_;
            fVar208 = 1.0 - fVar207;
            fVar187 = fVar207 * fVar207;
            auVar83 = SUB6416(ZEXT464(0x40400000),0);
            auVar84 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar250 = vfmadd213ss_fma(auVar83,local_9c0._0_16_,auVar84);
            auVar88 = vfmadd213ss_fma(auVar250,ZEXT416((uint)fVar187),SUB6416(ZEXT464(0x40000000),0)
                                     );
            auVar272 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar208),auVar84);
            auVar272 = vfmadd213ss_fma(auVar272,ZEXT416((uint)(fVar208 * fVar208)),
                                       SUB6416(ZEXT464(0x40000000),0));
            fVar204 = fVar208 * fVar208 * -fVar207 * 0.5;
            fVar205 = auVar88._0_4_ * 0.5;
            fVar206 = auVar272._0_4_ * 0.5;
            fVar207 = fVar207 * fVar207 * -fVar208 * 0.5;
            auVar153._0_4_ = fVar207 * (float)local_970._0_4_;
            auVar153._4_4_ = fVar207 * (float)local_970._4_4_;
            auVar153._8_4_ = fVar207 * fStack_968;
            auVar153._12_4_ = fVar207 * fStack_964;
            auVar170._4_4_ = fVar206;
            auVar170._0_4_ = fVar206;
            auVar170._8_4_ = fVar206;
            auVar170._12_4_ = fVar206;
            auVar88 = vfmadd132ps_fma(auVar170,auVar153,local_950);
            auVar131._4_4_ = fVar205;
            auVar131._0_4_ = fVar205;
            auVar131._8_4_ = fVar205;
            auVar131._12_4_ = fVar205;
            auVar88 = vfmadd132ps_fma(auVar131,auVar88,local_960);
            auVar154._4_4_ = fVar204;
            auVar154._0_4_ = fVar204;
            auVar154._8_4_ = fVar204;
            auVar154._12_4_ = fVar204;
            auVar88 = vfmadd132ps_fma(auVar154,auVar88,local_940);
            auVar84 = vfmadd231ss_fma(auVar84,local_9c0._0_16_,ZEXT416(0x41100000));
            auVar272 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_9c0._0_16_,
                                       ZEXT416(0x40800000));
            local_900._0_16_ = auVar272;
            local_760._0_16_ = auVar88;
            auVar88 = vsubps_avx(auVar271,auVar88);
            _local_860 = auVar88;
            auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
            auVar271 = vfmadd213ss_fma(auVar83,local_9c0._0_16_,ZEXT416(0xbf800000));
            local_9e0._0_16_ = auVar271;
            local_a60._0_16_ = auVar88;
            if (auVar88._0_4_ < 0.0) {
              local_a20._0_4_ = auVar250._0_4_;
              local_a40._0_16_ = ZEXT416((uint)fVar208);
              local_a80._0_4_ = fVar187;
              local_880._0_16_ = auVar84;
              local_840._0_4_ = fVar208 * -2.0;
              auVar279._0_4_ = sqrtf(auVar88._0_4_);
              auVar279._4_60_ = extraout_var;
              auVar250 = ZEXT416((uint)local_a20._0_4_);
              auVar88 = auVar279._0_16_;
              uVar74 = extraout_RAX_00;
              fVar204 = (float)local_840._0_4_;
              auVar271 = local_a40._0_16_;
              fVar187 = (float)local_a80._0_4_;
              auVar84 = local_880._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(auVar88,auVar88);
              fVar204 = fVar208 * -2.0;
              auVar271 = ZEXT416((uint)fVar208);
            }
            fVar206 = auVar271._0_4_;
            fVar205 = local_9c0._0_4_;
            auVar250 = vfmadd213ss_fma(auVar250,ZEXT416((uint)(fVar205 + fVar205)),
                                       ZEXT416((uint)(fVar205 * fVar205 * 3.0)));
            auVar135 = SUB6416(ZEXT464(0x40000000),0);
            auVar272 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_9c0._0_16_,auVar135);
            auVar272 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                       ZEXT416((uint)(fVar206 + fVar206)),auVar272);
            auVar83 = vfnmadd231ss_fma(ZEXT416((uint)(fVar205 * (fVar206 + fVar206))),auVar271,
                                       auVar271);
            auVar271 = vfmadd213ss_fma(ZEXT416((uint)fVar204),local_9c0._0_16_,
                                       ZEXT416((uint)fVar187));
            fVar187 = auVar272._0_4_ * 0.5;
            fVar204 = auVar271._0_4_ * 0.5;
            auVar132._0_4_ = (float)local_970._0_4_ * fVar204;
            auVar132._4_4_ = (float)local_970._4_4_ * fVar204;
            auVar132._8_4_ = fStack_968 * fVar204;
            auVar132._12_4_ = fStack_964 * fVar204;
            auVar115._4_4_ = fVar187;
            auVar115._0_4_ = fVar187;
            auVar115._8_4_ = fVar187;
            auVar115._12_4_ = fVar187;
            auVar271 = vfmadd213ps_fma(auVar115,local_950,auVar132);
            fVar187 = auVar83._0_4_ * 0.5;
            fVar204 = auVar250._0_4_ * 0.5;
            auVar133._4_4_ = fVar204;
            auVar133._0_4_ = fVar204;
            auVar133._8_4_ = fVar204;
            auVar133._12_4_ = fVar204;
            auVar271 = vfmadd213ps_fma(auVar133,local_960,auVar271);
            auVar251._4_4_ = fVar187;
            auVar251._0_4_ = fVar187;
            auVar251._8_4_ = fVar187;
            auVar251._12_4_ = fVar187;
            auVar83 = vfmadd213ps_fma(auVar251,local_940,auVar271);
            auVar272 = vfmadd213ss_fma(local_9c0._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar135);
            auVar89._0_4_ = (float)local_970._0_4_ * (float)local_9e0._0_4_;
            auVar89._4_4_ = (float)local_970._4_4_ * (float)local_9e0._0_4_;
            auVar89._8_4_ = fStack_968 * (float)local_9e0._0_4_;
            auVar89._12_4_ = fStack_964 * (float)local_9e0._0_4_;
            auVar116._4_4_ = local_900._0_4_;
            auVar116._0_4_ = local_900._0_4_;
            auVar116._8_4_ = local_900._0_4_;
            auVar116._12_4_ = local_900._0_4_;
            auVar271 = vfmadd213ps_fma(auVar116,local_950,auVar89);
            uVar77 = auVar84._0_4_;
            auVar134._4_4_ = uVar77;
            auVar134._0_4_ = uVar77;
            auVar134._8_4_ = uVar77;
            auVar134._12_4_ = uVar77;
            auVar271 = vfmadd213ps_fma(auVar134,local_960,auVar271);
            auVar250 = vdpps_avx(auVar83,auVar83,0x7f);
            uVar77 = auVar272._0_4_;
            auVar117._4_4_ = uVar77;
            auVar117._0_4_ = uVar77;
            auVar117._8_4_ = uVar77;
            auVar117._12_4_ = uVar77;
            auVar84 = vfmadd213ps_fma(auVar117,local_940,auVar271);
            auVar271 = vblendps_avx(auVar250,_DAT_01f45a50,0xe);
            auVar272 = vrsqrtss_avx(auVar271,auVar271);
            fVar205 = auVar250._0_4_;
            fVar187 = auVar272._0_4_;
            auVar272 = vdpps_avx(auVar83,auVar84,0x7f);
            fVar187 = fVar187 * 1.5 + fVar205 * -0.5 * fVar187 * fVar187 * fVar187;
            auVar118._0_4_ = auVar84._0_4_ * fVar205;
            auVar118._4_4_ = auVar84._4_4_ * fVar205;
            auVar118._8_4_ = auVar84._8_4_ * fVar205;
            auVar118._12_4_ = auVar84._12_4_ * fVar205;
            fVar204 = auVar272._0_4_;
            auVar193._0_4_ = auVar83._0_4_ * fVar204;
            auVar193._4_4_ = auVar83._4_4_ * fVar204;
            fVar206 = auVar83._8_4_;
            auVar193._8_4_ = fVar206 * fVar204;
            fVar207 = auVar83._12_4_;
            auVar193._12_4_ = fVar207 * fVar204;
            auVar272 = vsubps_avx(auVar118,auVar193);
            auVar271 = vrcpss_avx(auVar271,auVar271);
            auVar84 = vfnmadd213ss_fma(auVar271,auVar250,auVar135);
            fVar204 = auVar271._0_4_ * auVar84._0_4_;
            auVar271 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                  ZEXT416((uint)(fVar209 * (float)local_780._0_4_)));
            auVar266 = ZEXT1664(auVar271);
            auVar212._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
            auVar212._8_4_ = -fVar206;
            auVar212._12_4_ = -fVar207;
            auVar155._0_4_ = fVar187 * auVar272._0_4_ * fVar204;
            auVar155._4_4_ = fVar187 * auVar272._4_4_ * fVar204;
            auVar155._8_4_ = fVar187 * auVar272._8_4_ * fVar204;
            auVar155._12_4_ = fVar187 * auVar272._12_4_ * fVar204;
            auVar234._0_4_ = auVar83._0_4_ * fVar187;
            auVar234._4_4_ = auVar83._4_4_ * fVar187;
            auVar234._8_4_ = fVar206 * fVar187;
            auVar234._12_4_ = fVar207 * fVar187;
            local_9c0._0_16_ = auVar83;
            local_900._0_4_ = auVar271._0_4_;
            if (fVar205 < -fVar205) {
              local_9e0._0_4_ = auVar88._0_4_;
              local_a20._0_16_ = auVar212;
              local_a40._0_16_ = auVar234;
              local_a80._0_16_ = auVar155;
              fVar187 = sqrtf(fVar205);
              auVar266 = ZEXT464((uint)local_900._0_4_);
              auVar88 = ZEXT416((uint)local_9e0._0_4_);
              uVar74 = extraout_RAX_01;
              auVar155 = local_a80._0_16_;
              auVar212 = local_a20._0_16_;
              auVar234 = local_a40._0_16_;
            }
            else {
              auVar271 = vsqrtss_avx(auVar250,auVar250);
              fVar187 = auVar271._0_4_;
            }
            auVar271 = vdpps_avx(_local_860,auVar234,0x7f);
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar88,auVar266._0_16_);
            auVar250 = vdpps_avx(auVar212,auVar234,0x7f);
            auVar272 = vdpps_avx(_local_860,auVar155,0x7f);
            auVar84 = vdpps_avx(local_8a0._0_16_,auVar234,0x7f);
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                      ZEXT416((uint)((float)local_9a0._0_4_ / fVar187)),auVar83);
            fVar187 = auVar250._0_4_ + auVar272._0_4_;
            auVar90._0_4_ = auVar271._0_4_ * auVar271._0_4_;
            auVar90._4_4_ = auVar271._4_4_ * auVar271._4_4_;
            auVar90._8_4_ = auVar271._8_4_ * auVar271._8_4_;
            auVar90._12_4_ = auVar271._12_4_ * auVar271._12_4_;
            auVar88 = vdpps_avx(_local_860,auVar212,0x7f);
            auVar272 = vsubps_avx(local_a60._0_16_,auVar90);
            auVar250 = vrsqrtss_avx(auVar272,auVar272);
            fVar205 = auVar272._0_4_;
            fVar204 = auVar250._0_4_;
            fVar204 = fVar204 * 1.5 + fVar205 * -0.5 * fVar204 * fVar204 * fVar204;
            auVar250 = vdpps_avx(_local_860,local_8a0._0_16_,0x7f);
            auVar88 = vfnmadd231ss_fma(auVar88,auVar271,ZEXT416((uint)fVar187));
            auVar250 = vfnmadd231ss_fma(auVar250,auVar271,auVar84);
            if (fVar205 < 0.0) {
              local_9e0._0_16_ = auVar271;
              local_a20._0_4_ = auVar83._0_4_;
              local_a40._0_16_ = ZEXT416((uint)fVar187);
              local_a80._0_16_ = auVar84;
              local_880._0_16_ = auVar88;
              local_840._0_4_ = fVar204;
              local_7a0._0_16_ = auVar250;
              fVar205 = sqrtf(fVar205);
              auVar266 = ZEXT464((uint)local_900._0_4_);
              uVar74 = extraout_RAX_02;
              fVar204 = (float)local_840._0_4_;
              auVar250 = local_7a0._0_16_;
              auVar88 = local_880._0_16_;
              auVar271 = local_9e0._0_16_;
              auVar84 = local_a80._0_16_;
              auVar272 = local_a40._0_16_;
              fVar187 = (float)local_a20._0_4_;
            }
            else {
              auVar272 = vsqrtss_avx(auVar272,auVar272);
              fVar205 = auVar272._0_4_;
              auVar272 = ZEXT416((uint)fVar187);
              fVar187 = auVar83._0_4_;
            }
            auVar279 = ZEXT1664(auVar84);
            auVar231 = ZEXT1664(local_a60._0_16_);
            auVar217 = ZEXT3264(local_a00);
            auVar240 = ZEXT1664(local_9c0._0_16_);
            auVar83 = vpermilps_avx(local_760._0_16_,0xff);
            fVar205 = fVar205 - auVar83._0_4_;
            auVar83 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xff);
            auVar88 = vfmsub213ss_fma(auVar88,ZEXT416((uint)fVar204),auVar83);
            auVar156._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
            auVar156._8_4_ = auVar84._8_4_ ^ 0x80000000;
            auVar156._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar171._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
            auVar171._8_4_ = auVar88._8_4_ ^ 0x80000000;
            auVar171._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar135 = ZEXT416((uint)(auVar250._0_4_ * fVar204));
            auVar250 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar88._0_4_)),auVar272,
                                       auVar135);
            auVar88 = vinsertps_avx(auVar171,auVar135,0x1c);
            uVar77 = auVar250._0_4_;
            auVar172._4_4_ = uVar77;
            auVar172._0_4_ = uVar77;
            auVar172._8_4_ = uVar77;
            auVar172._12_4_ = uVar77;
            auVar88 = vdivps_avx(auVar88,auVar172);
            auVar250 = vinsertps_avx(auVar272,auVar156,0x10);
            auVar250 = vdivps_avx(auVar250,auVar172);
            fVar204 = auVar271._0_4_;
            auVar136._0_4_ = fVar204 * auVar88._0_4_ + fVar205 * auVar250._0_4_;
            auVar136._4_4_ = fVar204 * auVar88._4_4_ + fVar205 * auVar250._4_4_;
            auVar136._8_4_ = fVar204 * auVar88._8_4_ + fVar205 * auVar250._8_4_;
            auVar136._12_4_ = fVar204 * auVar88._12_4_ + fVar205 * auVar250._12_4_;
            auVar7 = vsubps_avx(auVar7,auVar136);
            auVar88 = vandps_avx(auVar271,local_980);
            if (auVar88._0_4_ < fVar187) {
              auVar271 = vfmadd231ss_fma(ZEXT416((uint)(auVar266._0_4_ + fVar187)),local_7c0._0_16_,
                                         ZEXT416(0x36000000));
              auVar88 = vandps_avx(ZEXT416((uint)fVar205),local_980);
              if (auVar88._0_4_ < auVar271._0_4_) {
                bVar79 = uVar76 < 5;
                fVar187 = auVar7._0_4_ + (float)local_820._0_4_;
                bVar69 = 0;
                if (((ray->org).field_0.m128[3] <= fVar187) &&
                   (fVar204 = ray->tfar, fVar187 <= fVar204)) {
                  auVar7 = vmovshdup_avx(auVar7);
                  fVar205 = auVar7._0_4_;
                  bVar69 = 0;
                  if ((0.0 <= fVar205) && (bVar69 = 0, fVar205 <= 1.0)) {
                    auVar7 = vrsqrtss_avx(local_a60._0_16_,local_a60._0_16_);
                    fVar206 = auVar7._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar71].ptr;
                    if ((pGVar4->mask & ray->mask) == 0) {
                      bVar69 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar69 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar206 = fVar206 * 1.5 + local_a60._0_4_ * -0.5 * fVar206 * fVar206 * fVar206
                      ;
                      auVar157._0_4_ = fVar206 * (float)local_860._0_4_;
                      auVar157._4_4_ = fVar206 * (float)local_860._4_4_;
                      auVar157._8_4_ = fVar206 * fStack_858;
                      auVar157._12_4_ = fVar206 * fStack_854;
                      auVar250 = vfmadd213ps_fma(auVar83,auVar157,local_9c0._0_16_);
                      auVar7 = vshufps_avx(auVar157,auVar157,0xc9);
                      auVar88 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                      auVar158._0_4_ = auVar157._0_4_ * auVar88._0_4_;
                      auVar158._4_4_ = auVar157._4_4_ * auVar88._4_4_;
                      auVar158._8_4_ = auVar157._8_4_ * auVar88._8_4_;
                      auVar158._12_4_ = auVar157._12_4_ * auVar88._12_4_;
                      auVar271 = vfmsub231ps_fma(auVar158,local_9c0._0_16_,auVar7);
                      auVar7 = vshufps_avx(auVar271,auVar271,0xc9);
                      auVar88 = vshufps_avx(auVar250,auVar250,0xc9);
                      auVar271 = vshufps_avx(auVar271,auVar271,0xd2);
                      auVar91._0_4_ = auVar250._0_4_ * auVar271._0_4_;
                      auVar91._4_4_ = auVar250._4_4_ * auVar271._4_4_;
                      auVar91._8_4_ = auVar250._8_4_ * auVar271._8_4_;
                      auVar91._12_4_ = auVar250._12_4_ * auVar271._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar91,auVar7,auVar88);
                      auVar7 = vshufps_avx(auVar88,auVar88,0xe9);
                      local_8e0 = vmovlps_avx(auVar7);
                      local_8d8 = auVar88._0_4_;
                      local_8d0 = 0;
                      local_8cc = (undefined4)local_8a8;
                      local_8c4 = context->user->instID[0];
                      local_8c0 = context->user->instPrimID[0];
                      ray->tfar = fVar187;
                      local_680._0_4_ = 0xffffffff;
                      local_930.valid = (int *)local_680;
                      local_930.geometryUserPtr = pGVar4->userPtr;
                      local_930.context = context->user;
                      local_930.hit = (RTCHitN *)&local_8e0;
                      local_930.N = 1;
                      local_930.ray = (RTCRayN *)ray;
                      local_8d4 = fVar205;
                      local_8c8 = uVar71;
                      if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01166d98:
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar231 = ZEXT1664(auVar231._0_16_);
                          auVar240 = ZEXT1664(auVar240._0_16_);
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          (*p_Var5)(&local_930);
                          if (*local_930.valid == 0) goto LAB_01166de1;
                        }
                        bVar69 = 1;
                      }
                      else {
                        auVar231 = ZEXT1664(local_a60._0_16_);
                        auVar240 = ZEXT1664(local_9c0._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        auVar279 = ZEXT1664(auVar84);
                        (*pGVar4->occlusionFilterN)(&local_930);
                        if (*local_930.valid != 0) goto LAB_01166d98;
LAB_01166de1:
                        ray->tfar = fVar204;
                        bVar69 = 0;
                      }
                      auVar217 = ZEXT3264(local_a00);
                    }
                  }
                }
                goto LAB_01166b9b;
              }
            }
            uVar76 = uVar76 + 1;
          }
          bVar79 = false;
LAB_01166b9b:
          fVar187 = ray->tfar;
          auVar106._4_4_ = fVar187;
          auVar106._0_4_ = fVar187;
          auVar106._8_4_ = fVar187;
          auVar106._12_4_ = fVar187;
          auVar106._16_4_ = fVar187;
          auVar106._20_4_ = fVar187;
          auVar106._24_4_ = fVar187;
          auVar106._28_4_ = fVar187;
          bVar78 = bVar78 | bVar79 & bVar69;
          auVar123 = vcmpps_avx(_local_800,auVar106,2);
          auVar123 = vandps_avx(auVar123,local_380);
          auVar255 = ZEXT3264(local_7e0);
        }
        auVar107._0_4_ = auVar255._0_4_ + (float)local_6a0._0_4_;
        auVar107._4_4_ = auVar255._4_4_ + (float)local_6a0._4_4_;
        auVar107._8_4_ = auVar255._8_4_ + fStack_698;
        auVar107._12_4_ = auVar255._12_4_ + fStack_694;
        auVar107._16_4_ = auVar255._16_4_ + fStack_690;
        auVar107._20_4_ = auVar255._20_4_ + fStack_68c;
        auVar107._24_4_ = auVar255._24_4_ + fStack_688;
        auVar107._28_4_ = auVar255._28_4_ + fStack_684;
        fVar204 = ray->tfar;
        fVar187 = ray->tfar;
        auVar148._4_4_ = fVar187;
        auVar148._0_4_ = fVar187;
        auVar148._8_4_ = fVar187;
        auVar148._12_4_ = fVar187;
        auVar148._16_4_ = fVar187;
        auVar148._20_4_ = fVar187;
        auVar148._24_4_ = fVar187;
        auVar148._28_4_ = fVar187;
        auVar123 = vcmpps_avx(auVar107,auVar148,2);
        local_7e0 = vandps_avx(auVar123,auVar217._0_32_);
        auVar108._8_4_ = 3;
        auVar108._0_8_ = 0x300000003;
        auVar108._12_4_ = 3;
        auVar108._16_4_ = 3;
        auVar108._20_4_ = 3;
        auVar108._24_4_ = 3;
        auVar108._28_4_ = 3;
        auVar149._8_4_ = 2;
        auVar149._0_8_ = 0x200000002;
        auVar149._12_4_ = 2;
        auVar149._16_4_ = 2;
        auVar149._20_4_ = 2;
        auVar149._24_4_ = 2;
        auVar149._28_4_ = 2;
        auVar123 = vblendvps_avx(auVar149,auVar108,local_640);
        _local_800 = vpcmpgtd_avx2(auVar123,local_660);
        local_680 = vpandn_avx2(_local_800,local_7e0);
        local_7c0 = _local_5a0;
        local_700._4_4_ = (float)local_6a0._4_4_ + (float)local_5a0._4_4_;
        local_700._0_4_ = (float)local_6a0._0_4_ + (float)local_5a0._0_4_;
        fStack_6f8 = fStack_698 + fStack_598;
        fStack_6f4 = fStack_694 + fStack_594;
        fStack_6f0 = fStack_690 + fStack_590;
        fStack_6ec = fStack_68c + fStack_58c;
        fStack_6e8 = fStack_688 + fStack_588;
        fStack_6e4 = fStack_684 + fStack_584;
        for (; (((((((local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_680 >> 0x7f,0) != '\0') ||
                 (local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_680 >> 0xbf,0) != '\0') ||
               (local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_680[0x1f] < '\0'; local_680 = vandps_avx(auVar123,local_680)) {
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar123 = vblendvps_avx(auVar130,local_7c0,local_680);
          auVar176 = vshufps_avx(auVar123,auVar123,0xb1);
          auVar176 = vminps_avx(auVar123,auVar176);
          auVar265 = vshufpd_avx(auVar176,auVar176,5);
          auVar176 = vminps_avx(auVar176,auVar265);
          auVar265 = vpermpd_avx2(auVar176,0x4e);
          auVar176 = vminps_avx(auVar176,auVar265);
          auVar176 = vcmpps_avx(auVar123,auVar176,0);
          auVar265 = local_680 & auVar176;
          auVar123 = local_680;
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar265 >> 0x7f,0) != '\0') ||
                (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar265 >> 0xbf,0) != '\0') ||
              (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar265[0x1f] < '\0') {
            auVar123 = vandps_avx(auVar176,local_680);
          }
          uVar70 = vmovmskps_avx(auVar123);
          iVar13 = 0;
          for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            iVar13 = iVar13 + 1;
          }
          uVar74 = (ulong)(uint)(iVar13 << 2);
          *(undefined4 *)(local_680 + uVar74) = 0;
          aVar1 = (ray->dir).field_0;
          local_8a0._0_16_ = (undefined1  [16])aVar1;
          auVar7 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          uVar70 = *(uint *)(local_1c0 + uVar74);
          auVar231 = ZEXT464(*(uint *)(local_580 + uVar74));
          if (auVar7._0_4_ < 0.0) {
            local_a60._0_16_ = ZEXT416(*(uint *)(local_580 + uVar74));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar255 = ZEXT1664(auVar255._0_16_);
            auVar266 = ZEXT1664(auVar266._0_16_);
            auVar279 = ZEXT1664(auVar279._0_16_);
            fVar187 = sqrtf(auVar7._0_4_);
            auVar231 = ZEXT1664(local_a60._0_16_);
            uVar74 = extraout_RAX_03;
          }
          else {
            auVar7 = vsqrtss_avx(auVar7,auVar7);
            fVar187 = auVar7._0_4_;
          }
          auVar217 = ZEXT464(uVar70);
          auVar88 = vminps_avx(local_940,local_960);
          auVar7 = vmaxps_avx(local_940,local_960);
          auVar271 = vminps_avx(local_950,_local_970);
          auVar250 = vminps_avx(auVar88,auVar271);
          auVar88 = vmaxps_avx(local_950,_local_970);
          auVar271 = vmaxps_avx(auVar7,auVar88);
          auVar7 = vandps_avx(auVar250,local_980);
          auVar88 = vandps_avx(auVar271,local_980);
          auVar7 = vmaxps_avx(auVar7,auVar88);
          auVar88 = vmovshdup_avx(auVar7);
          auVar88 = vmaxss_avx(auVar88,auVar7);
          auVar7 = vshufpd_avx(auVar7,auVar7,1);
          auVar7 = vmaxss_avx(auVar7,auVar88);
          local_9a0._0_4_ = auVar7._0_4_ * 1.9073486e-06;
          local_780._0_4_ = fVar187 * 1.9073486e-06;
          local_7a0._0_16_ = vshufps_avx(auVar271,auVar271,0xff);
          auVar7 = vinsertps_avx(auVar231._0_16_,ZEXT416(uVar70),0x10);
          uVar76 = 0;
          while( true ) {
            bVar69 = (byte)uVar74;
            if (uVar76 == 5) break;
            fVar209 = auVar7._0_4_;
            auVar92._4_4_ = fVar209;
            auVar92._0_4_ = fVar209;
            auVar92._8_4_ = fVar209;
            auVar92._12_4_ = fVar209;
            auVar271 = vfmadd213ps_fma(auVar92,local_8a0._0_16_,_DAT_01f45a50);
            local_9c0._0_16_ = vmovshdup_avx(auVar7);
            fVar207 = local_9c0._0_4_;
            fVar208 = 1.0 - fVar207;
            fVar187 = fVar207 * fVar207;
            auVar83 = SUB6416(ZEXT464(0x40400000),0);
            auVar84 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar250 = vfmadd213ss_fma(auVar83,local_9c0._0_16_,auVar84);
            auVar88 = vfmadd213ss_fma(auVar250,ZEXT416((uint)fVar187),SUB6416(ZEXT464(0x40000000),0)
                                     );
            auVar272 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar208),auVar84);
            auVar272 = vfmadd213ss_fma(auVar272,ZEXT416((uint)(fVar208 * fVar208)),
                                       SUB6416(ZEXT464(0x40000000),0));
            fVar204 = fVar208 * fVar208 * -fVar207 * 0.5;
            fVar205 = auVar88._0_4_ * 0.5;
            fVar206 = auVar272._0_4_ * 0.5;
            fVar207 = fVar207 * fVar207 * -fVar208 * 0.5;
            auVar159._0_4_ = fVar207 * (float)local_970._0_4_;
            auVar159._4_4_ = fVar207 * (float)local_970._4_4_;
            auVar159._8_4_ = fVar207 * fStack_968;
            auVar159._12_4_ = fVar207 * fStack_964;
            auVar173._4_4_ = fVar206;
            auVar173._0_4_ = fVar206;
            auVar173._8_4_ = fVar206;
            auVar173._12_4_ = fVar206;
            auVar88 = vfmadd132ps_fma(auVar173,auVar159,local_950);
            auVar137._4_4_ = fVar205;
            auVar137._0_4_ = fVar205;
            auVar137._8_4_ = fVar205;
            auVar137._12_4_ = fVar205;
            auVar88 = vfmadd132ps_fma(auVar137,auVar88,local_960);
            auVar160._4_4_ = fVar204;
            auVar160._0_4_ = fVar204;
            auVar160._8_4_ = fVar204;
            auVar160._12_4_ = fVar204;
            auVar88 = vfmadd132ps_fma(auVar160,auVar88,local_940);
            auVar84 = vfmadd231ss_fma(auVar84,local_9c0._0_16_,ZEXT416(0x41100000));
            auVar272 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_9c0._0_16_,
                                       ZEXT416(0x40800000));
            local_900._0_16_ = auVar272;
            local_760._0_16_ = auVar88;
            auVar88 = vsubps_avx(auVar271,auVar88);
            _local_860 = auVar88;
            auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
            auVar271 = vfmadd213ss_fma(auVar83,local_9c0._0_16_,ZEXT416(0xbf800000));
            local_9e0._0_16_ = auVar271;
            local_a60._0_16_ = auVar88;
            if (auVar88._0_4_ < 0.0) {
              local_a00._0_4_ = auVar250._0_4_;
              local_a20._0_16_ = ZEXT416((uint)fVar208);
              local_a40._0_4_ = fVar187;
              local_a80._0_16_ = auVar84;
              local_880._0_4_ = fVar208 * -2.0;
              auVar266._0_4_ = sqrtf(auVar88._0_4_);
              auVar266._4_60_ = extraout_var_00;
              auVar250 = ZEXT416((uint)local_a00._0_4_);
              auVar88 = auVar266._0_16_;
              uVar74 = extraout_RAX_04;
              fVar204 = (float)local_880._0_4_;
              auVar271 = local_a20._0_16_;
              fVar187 = (float)local_a40._0_4_;
              auVar84 = local_a80._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(auVar88,auVar88);
              fVar204 = fVar208 * -2.0;
              auVar271 = ZEXT416((uint)fVar208);
            }
            fVar206 = auVar271._0_4_;
            fVar205 = local_9c0._0_4_;
            auVar250 = vfmadd213ss_fma(auVar250,ZEXT416((uint)(fVar205 + fVar205)),
                                       ZEXT416((uint)(fVar205 * fVar205 * 3.0)));
            auVar135 = SUB6416(ZEXT464(0x40000000),0);
            auVar272 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_9c0._0_16_,auVar135);
            auVar272 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                       ZEXT416((uint)(fVar206 + fVar206)),auVar272);
            auVar83 = vfnmadd231ss_fma(ZEXT416((uint)(fVar205 * (fVar206 + fVar206))),auVar271,
                                       auVar271);
            auVar271 = vfmadd213ss_fma(ZEXT416((uint)fVar204),local_9c0._0_16_,
                                       ZEXT416((uint)fVar187));
            fVar187 = auVar272._0_4_ * 0.5;
            fVar204 = auVar271._0_4_ * 0.5;
            auVar138._0_4_ = (float)local_970._0_4_ * fVar204;
            auVar138._4_4_ = (float)local_970._4_4_ * fVar204;
            auVar138._8_4_ = fStack_968 * fVar204;
            auVar138._12_4_ = fStack_964 * fVar204;
            auVar119._4_4_ = fVar187;
            auVar119._0_4_ = fVar187;
            auVar119._8_4_ = fVar187;
            auVar119._12_4_ = fVar187;
            auVar271 = vfmadd213ps_fma(auVar119,local_950,auVar138);
            fVar187 = auVar83._0_4_ * 0.5;
            fVar204 = auVar250._0_4_ * 0.5;
            auVar139._4_4_ = fVar204;
            auVar139._0_4_ = fVar204;
            auVar139._8_4_ = fVar204;
            auVar139._12_4_ = fVar204;
            auVar271 = vfmadd213ps_fma(auVar139,local_960,auVar271);
            auVar252._4_4_ = fVar187;
            auVar252._0_4_ = fVar187;
            auVar252._8_4_ = fVar187;
            auVar252._12_4_ = fVar187;
            auVar83 = vfmadd213ps_fma(auVar252,local_940,auVar271);
            auVar272 = vfmadd213ss_fma(local_9c0._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar135);
            auVar93._0_4_ = (float)local_970._0_4_ * (float)local_9e0._0_4_;
            auVar93._4_4_ = (float)local_970._4_4_ * (float)local_9e0._0_4_;
            auVar93._8_4_ = fStack_968 * (float)local_9e0._0_4_;
            auVar93._12_4_ = fStack_964 * (float)local_9e0._0_4_;
            auVar120._4_4_ = local_900._0_4_;
            auVar120._0_4_ = local_900._0_4_;
            auVar120._8_4_ = local_900._0_4_;
            auVar120._12_4_ = local_900._0_4_;
            auVar271 = vfmadd213ps_fma(auVar120,local_950,auVar93);
            uVar77 = auVar84._0_4_;
            auVar140._4_4_ = uVar77;
            auVar140._0_4_ = uVar77;
            auVar140._8_4_ = uVar77;
            auVar140._12_4_ = uVar77;
            auVar271 = vfmadd213ps_fma(auVar140,local_960,auVar271);
            auVar250 = vdpps_avx(auVar83,auVar83,0x7f);
            uVar77 = auVar272._0_4_;
            auVar121._4_4_ = uVar77;
            auVar121._0_4_ = uVar77;
            auVar121._8_4_ = uVar77;
            auVar121._12_4_ = uVar77;
            auVar84 = vfmadd213ps_fma(auVar121,local_940,auVar271);
            auVar271 = vblendps_avx(auVar250,_DAT_01f45a50,0xe);
            auVar272 = vrsqrtss_avx(auVar271,auVar271);
            fVar205 = auVar250._0_4_;
            fVar187 = auVar272._0_4_;
            auVar272 = vdpps_avx(auVar83,auVar84,0x7f);
            fVar187 = fVar187 * 1.5 + fVar205 * -0.5 * fVar187 * fVar187 * fVar187;
            auVar122._0_4_ = auVar84._0_4_ * fVar205;
            auVar122._4_4_ = auVar84._4_4_ * fVar205;
            auVar122._8_4_ = auVar84._8_4_ * fVar205;
            auVar122._12_4_ = auVar84._12_4_ * fVar205;
            fVar204 = auVar272._0_4_;
            auVar194._0_4_ = auVar83._0_4_ * fVar204;
            auVar194._4_4_ = auVar83._4_4_ * fVar204;
            fVar206 = auVar83._8_4_;
            auVar194._8_4_ = fVar206 * fVar204;
            fVar207 = auVar83._12_4_;
            auVar194._12_4_ = fVar207 * fVar204;
            auVar272 = vsubps_avx(auVar122,auVar194);
            auVar271 = vrcpss_avx(auVar271,auVar271);
            auVar84 = vfnmadd213ss_fma(auVar271,auVar250,auVar135);
            fVar204 = auVar271._0_4_ * auVar84._0_4_;
            auVar271 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                  ZEXT416((uint)(fVar209 * (float)local_780._0_4_)));
            auVar240 = ZEXT1664(auVar271);
            auVar226._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
            auVar226._8_4_ = -fVar206;
            auVar226._12_4_ = -fVar207;
            auVar161._0_4_ = fVar187 * auVar272._0_4_ * fVar204;
            auVar161._4_4_ = fVar187 * auVar272._4_4_ * fVar204;
            auVar161._8_4_ = fVar187 * auVar272._8_4_ * fVar204;
            auVar161._12_4_ = fVar187 * auVar272._12_4_ * fVar204;
            auVar246._0_4_ = auVar83._0_4_ * fVar187;
            auVar246._4_4_ = auVar83._4_4_ * fVar187;
            auVar246._8_4_ = fVar206 * fVar187;
            auVar246._12_4_ = fVar207 * fVar187;
            local_9c0._0_16_ = auVar83;
            local_900._0_4_ = auVar271._0_4_;
            if (fVar205 < -fVar205) {
              local_9e0._0_4_ = auVar88._0_4_;
              local_a00._0_16_ = auVar226;
              local_a20._0_16_ = auVar246;
              local_a40._0_16_ = auVar161;
              fVar187 = sqrtf(fVar205);
              auVar240 = ZEXT464((uint)local_900._0_4_);
              auVar88 = ZEXT416((uint)local_9e0._0_4_);
              uVar74 = extraout_RAX_05;
              auVar161 = local_a40._0_16_;
              auVar226 = local_a00._0_16_;
              auVar246 = local_a20._0_16_;
            }
            else {
              auVar271 = vsqrtss_avx(auVar250,auVar250);
              fVar187 = auVar271._0_4_;
            }
            auVar271 = vdpps_avx(_local_860,auVar246,0x7f);
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar88,auVar240._0_16_);
            auVar250 = vdpps_avx(auVar226,auVar246,0x7f);
            auVar272 = vdpps_avx(_local_860,auVar161,0x7f);
            auVar84 = vdpps_avx(local_8a0._0_16_,auVar246,0x7f);
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                      ZEXT416((uint)((float)local_9a0._0_4_ / fVar187)),auVar83);
            fVar187 = auVar250._0_4_ + auVar272._0_4_;
            auVar266 = ZEXT464((uint)fVar187);
            auVar94._0_4_ = auVar271._0_4_ * auVar271._0_4_;
            auVar94._4_4_ = auVar271._4_4_ * auVar271._4_4_;
            auVar94._8_4_ = auVar271._8_4_ * auVar271._8_4_;
            auVar94._12_4_ = auVar271._12_4_ * auVar271._12_4_;
            auVar88 = vdpps_avx(_local_860,auVar226,0x7f);
            auVar272 = vsubps_avx(local_a60._0_16_,auVar94);
            auVar250 = vrsqrtss_avx(auVar272,auVar272);
            fVar205 = auVar272._0_4_;
            fVar204 = auVar250._0_4_;
            fVar204 = fVar204 * 1.5 + fVar205 * -0.5 * fVar204 * fVar204 * fVar204;
            auVar250 = vdpps_avx(_local_860,local_8a0._0_16_,0x7f);
            auVar88 = vfnmadd231ss_fma(auVar88,auVar271,ZEXT416((uint)fVar187));
            auVar250 = vfnmadd231ss_fma(auVar250,auVar271,auVar84);
            if (fVar205 < 0.0) {
              local_9e0._0_16_ = auVar271;
              local_a00._0_4_ = auVar83._0_4_;
              local_a20._0_16_ = ZEXT416((uint)fVar187);
              local_a40._0_16_ = auVar84;
              local_a80._0_16_ = auVar88;
              local_880._0_4_ = fVar204;
              local_840._0_16_ = auVar250;
              fVar187 = sqrtf(fVar205);
              auVar266 = ZEXT1664(local_a20._0_16_);
              auVar240 = ZEXT464((uint)local_900._0_4_);
              uVar74 = extraout_RAX_06;
              fVar204 = (float)local_880._0_4_;
              auVar250 = local_840._0_16_;
              auVar271 = local_9e0._0_16_;
              auVar84 = local_a40._0_16_;
              auVar88 = local_a80._0_16_;
              fVar205 = (float)local_a00._0_4_;
            }
            else {
              auVar272 = vsqrtss_avx(auVar272,auVar272);
              fVar187 = auVar272._0_4_;
              fVar205 = auVar83._0_4_;
            }
            auVar255 = ZEXT1664(auVar271);
            auVar217 = ZEXT1664(local_a60._0_16_);
            auVar231 = ZEXT1664(local_9c0._0_16_);
            auVar272 = vpermilps_avx(local_760._0_16_,0xff);
            fVar187 = fVar187 - auVar272._0_4_;
            auVar272 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xff);
            auVar83 = vfmsub213ss_fma(auVar88,ZEXT416((uint)fVar204),auVar272);
            auVar279 = ZEXT1664(auVar83);
            auVar162._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
            auVar162._8_4_ = auVar84._8_4_ ^ 0x80000000;
            auVar162._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar174._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
            auVar174._8_4_ = auVar83._8_4_ ^ 0x80000000;
            auVar174._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar88 = ZEXT416((uint)(auVar250._0_4_ * fVar204));
            auVar135 = auVar266._0_16_;
            auVar250 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar83._0_4_)),auVar135,
                                       auVar88);
            auVar88 = vinsertps_avx(auVar174,auVar88,0x1c);
            uVar77 = auVar250._0_4_;
            auVar175._4_4_ = uVar77;
            auVar175._0_4_ = uVar77;
            auVar175._8_4_ = uVar77;
            auVar175._12_4_ = uVar77;
            auVar88 = vdivps_avx(auVar88,auVar175);
            auVar250 = vinsertps_avx(auVar135,auVar162,0x10);
            auVar250 = vdivps_avx(auVar250,auVar175);
            fVar204 = auVar271._0_4_;
            auVar141._0_4_ = fVar204 * auVar88._0_4_ + fVar187 * auVar250._0_4_;
            auVar141._4_4_ = fVar204 * auVar88._4_4_ + fVar187 * auVar250._4_4_;
            auVar141._8_4_ = fVar204 * auVar88._8_4_ + fVar187 * auVar250._8_4_;
            auVar141._12_4_ = fVar204 * auVar88._12_4_ + fVar187 * auVar250._12_4_;
            auVar7 = vsubps_avx(auVar7,auVar141);
            auVar88 = vandps_avx(auVar271,local_980);
            if (auVar88._0_4_ < fVar205) {
              auVar250 = vfmadd231ss_fma(ZEXT416((uint)(auVar240._0_4_ + fVar205)),local_7a0._0_16_,
                                         ZEXT416(0x36000000));
              auVar88 = vandps_avx(ZEXT416((uint)fVar187),local_980);
              if (auVar88._0_4_ < auVar250._0_4_) {
                bVar79 = uVar76 < 5;
                fVar187 = auVar7._0_4_ + (float)local_820._0_4_;
                bVar69 = 0;
                if ((ray->org).field_0.m128[3] <= fVar187) {
                  fVar204 = ray->tfar;
                  auVar240 = ZEXT464((uint)fVar204);
                  if (fVar187 <= fVar204) {
                    auVar7 = vmovshdup_avx(auVar7);
                    fVar205 = auVar7._0_4_;
                    bVar69 = 0;
                    if ((0.0 <= fVar205) && (bVar69 = 0, fVar205 <= 1.0)) {
                      auVar7 = vrsqrtss_avx(local_a60._0_16_,local_a60._0_16_);
                      fVar206 = auVar7._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar71].ptr;
                      if ((pGVar4->mask & ray->mask) == 0) {
                        bVar69 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar69 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar206 = fVar206 * 1.5 +
                                  local_a60._0_4_ * -0.5 * fVar206 * fVar206 * fVar206;
                        auVar163._0_4_ = fVar206 * (float)local_860._0_4_;
                        auVar163._4_4_ = fVar206 * (float)local_860._4_4_;
                        auVar163._8_4_ = fVar206 * fStack_858;
                        auVar163._12_4_ = fVar206 * fStack_854;
                        auVar272 = vfmadd213ps_fma(auVar272,auVar163,local_9c0._0_16_);
                        auVar7 = vshufps_avx(auVar163,auVar163,0xc9);
                        auVar88 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                        auVar164._0_4_ = auVar163._0_4_ * auVar88._0_4_;
                        auVar164._4_4_ = auVar163._4_4_ * auVar88._4_4_;
                        auVar164._8_4_ = auVar163._8_4_ * auVar88._8_4_;
                        auVar164._12_4_ = auVar163._12_4_ * auVar88._12_4_;
                        auVar250 = vfmsub231ps_fma(auVar164,local_9c0._0_16_,auVar7);
                        auVar7 = vshufps_avx(auVar250,auVar250,0xc9);
                        auVar88 = vshufps_avx(auVar272,auVar272,0xc9);
                        auVar250 = vshufps_avx(auVar250,auVar250,0xd2);
                        auVar95._0_4_ = auVar272._0_4_ * auVar250._0_4_;
                        auVar95._4_4_ = auVar272._4_4_ * auVar250._4_4_;
                        auVar95._8_4_ = auVar272._8_4_ * auVar250._8_4_;
                        auVar95._12_4_ = auVar272._12_4_ * auVar250._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar95,auVar7,auVar88);
                        auVar7 = vshufps_avx(auVar88,auVar88,0xe9);
                        local_8e0 = vmovlps_avx(auVar7);
                        local_8d8 = auVar88._0_4_;
                        local_8d0 = 0;
                        local_8cc = (undefined4)local_8a8;
                        local_8c4 = context->user->instID[0];
                        local_8c0 = context->user->instPrimID[0];
                        ray->tfar = fVar187;
                        local_a84 = -1;
                        local_930.valid = &local_a84;
                        local_930.geometryUserPtr = pGVar4->userPtr;
                        local_930.context = context->user;
                        local_930.hit = (RTCHitN *)&local_8e0;
                        local_930.N = 1;
                        local_930.ray = (RTCRayN *)ray;
                        local_8d4 = fVar205;
                        local_8c8 = uVar71;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011677d0:
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar217 = ZEXT1664(auVar217._0_16_);
                            auVar231 = ZEXT1664(auVar231._0_16_);
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar279 = ZEXT1664(auVar279._0_16_);
                            (*p_Var5)(&local_930);
                            if (*local_930.valid == 0) goto LAB_01167819;
                          }
                          bVar69 = 1;
                        }
                        else {
                          auVar217 = ZEXT1664(local_a60._0_16_);
                          auVar231 = ZEXT1664(local_9c0._0_16_);
                          auVar240 = ZEXT464((uint)fVar204);
                          auVar255 = ZEXT1664(auVar271);
                          auVar266 = ZEXT1664(auVar135);
                          auVar279 = ZEXT1664(auVar83);
                          (*pGVar4->occlusionFilterN)(&local_930);
                          if (*local_930.valid != 0) goto LAB_011677d0;
LAB_01167819:
                          ray->tfar = fVar204;
                          bVar69 = 0;
                        }
                      }
                    }
                  }
                }
                goto LAB_011675d7;
              }
            }
            uVar76 = uVar76 + 1;
          }
          bVar79 = false;
LAB_011675d7:
          bVar78 = bVar78 | bVar79 & bVar69;
          fVar187 = ray->tfar;
          auVar109._4_4_ = fVar187;
          auVar109._0_4_ = fVar187;
          auVar109._8_4_ = fVar187;
          auVar109._12_4_ = fVar187;
          auVar109._16_4_ = fVar187;
          auVar109._20_4_ = fVar187;
          auVar109._24_4_ = fVar187;
          auVar109._28_4_ = fVar187;
          fVar204 = ray->tfar;
          auVar123 = vcmpps_avx(_local_700,auVar109,2);
        }
        auVar150._0_4_ = (float)local_6a0._0_4_ + local_560._0_4_;
        auVar150._4_4_ = (float)local_6a0._4_4_ + local_560._4_4_;
        auVar150._8_4_ = fStack_698 + local_560._8_4_;
        auVar150._12_4_ = fStack_694 + local_560._12_4_;
        auVar150._16_4_ = fStack_690 + local_560._16_4_;
        auVar150._20_4_ = fStack_68c + local_560._20_4_;
        auVar150._24_4_ = fStack_688 + local_560._24_4_;
        auVar150._28_4_ = fStack_684 + local_560._28_4_;
        auVar165._4_4_ = fVar204;
        auVar165._0_4_ = fVar204;
        auVar165._8_4_ = fVar204;
        auVar165._12_4_ = fVar204;
        auVar165._16_4_ = fVar204;
        auVar165._20_4_ = fVar204;
        auVar165._24_4_ = fVar204;
        auVar165._28_4_ = fVar204;
        auVar176 = vcmpps_avx(auVar150,auVar165,2);
        auVar123 = vandps_avx(local_620,local_600);
        auVar123 = vandps_avx(auVar176,auVar123);
        auVar181._0_4_ = (float)local_6a0._0_4_ + local_5a0._0_4_;
        auVar181._4_4_ = (float)local_6a0._4_4_ + local_5a0._4_4_;
        auVar181._8_4_ = fStack_698 + local_5a0._8_4_;
        auVar181._12_4_ = fStack_694 + local_5a0._12_4_;
        auVar181._16_4_ = fStack_690 + local_5a0._16_4_;
        auVar181._20_4_ = fStack_68c + local_5a0._20_4_;
        auVar181._24_4_ = fStack_688 + local_5a0._24_4_;
        auVar181._28_4_ = fStack_684 + local_5a0._28_4_;
        auVar265 = vcmpps_avx(auVar181,auVar165,2);
        auVar176 = vandps_avx(_local_800,local_7e0);
        auVar176 = vandps_avx(auVar265,auVar176);
        auVar176 = vorps_avx(auVar123,auVar176);
        if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar176 >> 0x7f,0) != '\0') ||
              (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar176 >> 0xbf,0) != '\0') ||
            (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar176[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar72 * 0x60) = auVar176;
          auVar123 = vblendvps_avx(_local_5a0,local_560,auVar123);
          *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x60) = auVar123;
          uVar74 = vmovlps_avx(local_5b0);
          (&uStack_140)[uVar72 * 0xc] = uVar74;
          aiStack_138[uVar72 * 0x18] = local_b04 + 1;
          uVar72 = (ulong)((int)uVar72 + 1);
        }
      }
    }
    fVar204 = ray->tfar;
    fVar187 = ray->tfar;
    auVar143._4_4_ = fVar187;
    auVar143._0_4_ = fVar187;
    auVar143._8_4_ = fVar187;
    auVar143._12_4_ = fVar187;
    auVar143._16_4_ = fVar187;
    auVar143._20_4_ = fVar187;
    auVar143._24_4_ = fVar187;
    auVar143._28_4_ = fVar187;
    while( true ) {
      uVar70 = (uint)uVar72;
      if (uVar70 == 0) {
        if (bVar78 != 0) goto LAB_011679e9;
        auVar96._4_4_ = fVar204;
        auVar96._0_4_ = fVar204;
        auVar96._8_4_ = fVar204;
        auVar96._12_4_ = fVar204;
        auVar10 = vcmpps_avx(local_5c0,auVar96,2);
        uVar71 = vmovmskps_avx(auVar10);
        local_808 = (ulong)((uint)local_810 & uVar71);
        goto LAB_01165349;
      }
      uVar72 = (ulong)(uVar70 - 1);
      lVar73 = uVar72 * 0x60;
      auVar123 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar125._0_4_ = auVar123._0_4_ + (float)local_6a0._0_4_;
      auVar125._4_4_ = auVar123._4_4_ + (float)local_6a0._4_4_;
      auVar125._8_4_ = auVar123._8_4_ + fStack_698;
      auVar125._12_4_ = auVar123._12_4_ + fStack_694;
      auVar125._16_4_ = auVar123._16_4_ + fStack_690;
      auVar125._20_4_ = auVar123._20_4_ + fStack_68c;
      auVar125._24_4_ = auVar123._24_4_ + fStack_688;
      auVar125._28_4_ = auVar123._28_4_ + fStack_684;
      auVar265 = vcmpps_avx(auVar125,auVar143,2);
      auVar176 = vandps_avx(auVar265,*(undefined1 (*) [32])(auStack_180 + lVar73));
      local_560 = auVar176;
      auVar265 = *(undefined1 (*) [32])(auStack_180 + lVar73) & auVar265;
      if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar265 >> 0x7f,0) != '\0') ||
            (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar265 >> 0xbf,0) != '\0') ||
          (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar265[0x1f] < '\0') break;
      uVar72 = (ulong)(uVar70 - 1);
    }
    auVar102._8_4_ = 0x7f800000;
    auVar102._0_8_ = 0x7f8000007f800000;
    auVar102._12_4_ = 0x7f800000;
    auVar102._16_4_ = 0x7f800000;
    auVar102._20_4_ = 0x7f800000;
    auVar102._24_4_ = 0x7f800000;
    auVar102._28_4_ = 0x7f800000;
    auVar123 = vblendvps_avx(auVar102,auVar123,auVar176);
    auVar265 = vshufps_avx(auVar123,auVar123,0xb1);
    auVar265 = vminps_avx(auVar123,auVar265);
    auVar6 = vshufpd_avx(auVar265,auVar265,5);
    auVar265 = vminps_avx(auVar265,auVar6);
    auVar6 = vpermpd_avx2(auVar265,0x4e);
    auVar265 = vminps_avx(auVar265,auVar6);
    auVar123 = vcmpps_avx(auVar123,auVar265,0);
    auVar265 = auVar176 & auVar123;
    if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar265 >> 0x7f,0) != '\0') ||
          (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar265 >> 0xbf,0) != '\0') ||
        (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar265[0x1f] < '\0') {
      auVar176 = vandps_avx(auVar123,auVar176);
    }
    uVar75 = vmovmskps_avx(auVar176);
    iVar13 = 0;
    for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
      iVar13 = iVar13 + 1;
    }
    *(undefined4 *)(local_560 + (uint)(iVar13 << 2)) = 0;
    uVar74 = (&uStack_140)[uVar72 * 0xc];
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar74;
    local_b04 = aiStack_138[uVar72 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar73) = local_560;
    uVar75 = uVar70 - 1;
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_560 >> 0x7f,0) != '\0') ||
          (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_560 >> 0xbf,0) != '\0') ||
        (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_560[0x1f] < '\0') {
      uVar75 = uVar70;
    }
    uVar77 = (undefined4)uVar74;
    auVar126._4_4_ = uVar77;
    auVar126._0_4_ = uVar77;
    auVar126._8_4_ = uVar77;
    auVar126._12_4_ = uVar77;
    auVar126._16_4_ = uVar77;
    auVar126._20_4_ = uVar77;
    auVar126._24_4_ = uVar77;
    auVar126._28_4_ = uVar77;
    auVar7 = vmovshdup_avx(auVar86);
    auVar7 = vsubps_avx(auVar7,auVar86);
    auVar103._0_4_ = auVar7._0_4_;
    auVar103._4_4_ = auVar103._0_4_;
    auVar103._8_4_ = auVar103._0_4_;
    auVar103._12_4_ = auVar103._0_4_;
    auVar103._16_4_ = auVar103._0_4_;
    auVar103._20_4_ = auVar103._0_4_;
    auVar103._24_4_ = auVar103._0_4_;
    auVar103._28_4_ = auVar103._0_4_;
    auVar7 = vfmadd132ps_fma(auVar103,auVar126,_DAT_01f7b040);
    _local_5a0 = ZEXT1632(auVar7);
    local_5b0._8_8_ = 0;
    local_5b0._0_8_ = *(ulong *)(local_5a0 + (uint)(iVar13 << 2));
    uVar72 = (ulong)uVar75;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }